

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void __thiscall
embree::SceneGraphFlattener::convertGeometries
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node,Transformations *spaces)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  undefined8 *puVar4;
  float *pfVar5;
  undefined8 uVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  Node *pNVar10;
  size_t sVar11;
  long lVar12;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar13;
  Ref<embree::SceneGraph::Node> *pRVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  byte bVar56;
  undefined4 uVar57;
  long *plVar58;
  ulong uVar59;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar60;
  TriangleMeshNode *pTVar61;
  BBox1f BVar62;
  QuadMeshNode *pQVar63;
  GridMeshNode *pGVar64;
  SubdivMeshNode *pSVar65;
  HairSetNode *pHVar66;
  PointSetNode *pPVar67;
  runtime_error *prVar68;
  byte bVar70;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong extraout_RDX_14;
  ulong extraout_RDX_15;
  ulong uVar71;
  ulong extraout_RDX_16;
  ulong extraout_RDX_17;
  ulong extraout_RDX_18;
  ulong extraout_RDX_19;
  ulong extraout_RDX_20;
  ulong extraout_RDX_21;
  ulong extraout_RDX_22;
  ulong extraout_RDX_23;
  Ref<embree::SceneGraph::Node> *child;
  Ref<embree::SceneGraph::Node> *node_00;
  ulong uVar72;
  undefined8 *puVar73;
  long lVar74;
  uint uVar75;
  int iVar76;
  uint uVar77;
  int iVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  Transformations c;
  float local_198;
  float local_188;
  float fStack_184;
  undefined1 local_178 [24];
  size_t sStack_160;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_158;
  bool local_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
  *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  float fStack_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  SceneGraphFlattener *local_80;
  Ref<embree::SceneGraph::PointSetNode> local_78;
  Ref<embree::SceneGraph::HairSetNode> local_70;
  Ref<embree::SceneGraph::SubdivMeshNode> local_68;
  Ref<embree::SceneGraph::GridMeshNode> local_60;
  Ref<embree::SceneGraph::QuadMeshNode> local_58;
  Ref<embree::SceneGraph::TriangleMeshNode> local_50;
  long *local_48;
  Ref<embree::SceneGraph::Node> *local_40;
  ulong local_38;
  undefined7 uVar69;
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  
  pNVar10 = node->ptr;
  if (pNVar10 == (Node *)0x0) {
    return;
  }
  local_130 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
               *)group;
  local_80 = this;
  plVar58 = (long *)__dynamic_cast(pNVar10,&SceneGraph::Node::typeinfo,
                                   &SceneGraph::TransformNode::typeinfo,0);
  if (plVar58 == (long *)0x0) {
    plVar58 = (long *)__dynamic_cast(pNVar10,&SceneGraph::Node::typeinfo,
                                     &SceneGraph::MultiTransformNode::typeinfo,0);
    if (plVar58 == (long *)0x0) {
      plVar58 = (long *)__dynamic_cast(pNVar10,&SceneGraph::Node::typeinfo,
                                       &SceneGraph::GroupNode::typeinfo,0);
      if (plVar58 != (long *)0x0) {
        (**(code **)(*plVar58 + 0x10))(plVar58);
        pRVar14 = (Ref<embree::SceneGraph::Node> *)plVar58[0xe];
        for (node_00 = (Ref<embree::SceneGraph::Node> *)plVar58[0xd]; node_00 != pRVar14;
            node_00 = node_00 + 1) {
          convertGeometries(local_80,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                      *)local_130,node_00,spaces);
        }
        (**(code **)(*plVar58 + 0x18))(plVar58);
        return;
      }
      pTVar61 = (TriangleMeshNode *)
                __dynamic_cast(pNVar10,&SceneGraph::Node::typeinfo,
                               &SceneGraph::TriangleMeshNode::typeinfo,0);
      if (pTVar61 != (TriangleMeshNode *)0x0) {
        (*(pTVar61->super_Node).super_RefCount._vptr_RefCount[2])(pTVar61);
        BVar62 = (BBox1f)operator_new(0xd8);
        local_50.ptr = pTVar61;
        (*(pTVar61->super_Node).super_RefCount._vptr_RefCount[2])(pTVar61);
        SceneGraph::TriangleMeshNode::TriangleMeshNode((TriangleMeshNode *)BVar62,&local_50,spaces);
        local_178._0_8_ = BVar62;
        (**(code **)(*(long *)BVar62 + 0x10))(BVar62);
        std::
        vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
        ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                  (local_130,(Ref<embree::SceneGraph::Node> *)local_178);
        if ((BBox1f)local_178._0_8_ != (BBox1f)0x0) {
          (**(code **)(*(long *)local_178._0_8_ + 0x18))();
        }
        if (local_50.ptr != (TriangleMeshNode *)0x0) {
          (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
        }
        (*(pTVar61->super_Node).super_RefCount._vptr_RefCount[3])(pTVar61);
        return;
      }
      pQVar63 = (QuadMeshNode *)
                __dynamic_cast(pNVar10,&SceneGraph::Node::typeinfo,
                               &SceneGraph::QuadMeshNode::typeinfo,0);
      if (pQVar63 != (QuadMeshNode *)0x0) {
        (*(pQVar63->super_Node).super_RefCount._vptr_RefCount[2])(pQVar63);
        BVar62 = (BBox1f)operator_new(0xd8);
        local_58.ptr = pQVar63;
        (*(pQVar63->super_Node).super_RefCount._vptr_RefCount[2])(pQVar63);
        SceneGraph::QuadMeshNode::QuadMeshNode((QuadMeshNode *)BVar62,&local_58,spaces);
        local_178._0_8_ = BVar62;
        (**(code **)(*(long *)BVar62 + 0x10))(BVar62);
        std::
        vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
        ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                  (local_130,(Ref<embree::SceneGraph::Node> *)local_178);
        if ((BBox1f)local_178._0_8_ != (BBox1f)0x0) {
          (**(code **)(*(long *)local_178._0_8_ + 0x18))();
        }
        if (local_58.ptr != (QuadMeshNode *)0x0) {
          (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
        }
        (*(pQVar63->super_Node).super_RefCount._vptr_RefCount[3])(pQVar63);
        return;
      }
      pGVar64 = (GridMeshNode *)
                __dynamic_cast(pNVar10,&SceneGraph::Node::typeinfo,
                               &SceneGraph::GridMeshNode::typeinfo,0);
      if (pGVar64 != (GridMeshNode *)0x0) {
        (*(pGVar64->super_Node).super_RefCount._vptr_RefCount[2])(pGVar64);
        BVar62 = (BBox1f)operator_new(0xa8);
        local_60.ptr = pGVar64;
        (*(pGVar64->super_Node).super_RefCount._vptr_RefCount[2])(pGVar64);
        SceneGraph::GridMeshNode::GridMeshNode((GridMeshNode *)BVar62,&local_60,spaces);
        local_178._0_8_ = BVar62;
        (**(code **)(*(long *)BVar62 + 0x10))(BVar62);
        std::
        vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
        ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                  (local_130,(Ref<embree::SceneGraph::Node> *)local_178);
        if ((BBox1f)local_178._0_8_ != (BBox1f)0x0) {
          (**(code **)(*(long *)local_178._0_8_ + 0x18))();
        }
        if (local_60.ptr != (GridMeshNode *)0x0) {
          (*((local_60.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
        }
        (*(pGVar64->super_Node).super_RefCount._vptr_RefCount[3])(pGVar64);
        return;
      }
      pSVar65 = (SubdivMeshNode *)
                __dynamic_cast(pNVar10,&SceneGraph::Node::typeinfo,
                               &SceneGraph::SubdivMeshNode::typeinfo,0);
      if (pSVar65 != (SubdivMeshNode *)0x0) {
        (*(pSVar65->super_Node).super_RefCount._vptr_RefCount[2])(pSVar65);
        BVar62 = (BBox1f)operator_new(0x1b0);
        local_68.ptr = pSVar65;
        (*(pSVar65->super_Node).super_RefCount._vptr_RefCount[2])(pSVar65);
        SceneGraph::SubdivMeshNode::SubdivMeshNode((SubdivMeshNode *)BVar62,&local_68,spaces);
        local_178._0_8_ = BVar62;
        (**(code **)(*(long *)BVar62 + 0x10))(BVar62);
        std::
        vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
        ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                  (local_130,(Ref<embree::SceneGraph::Node> *)local_178);
        if ((BBox1f)local_178._0_8_ != (BBox1f)0x0) {
          (**(code **)(*(long *)local_178._0_8_ + 0x18))();
        }
        if (local_68.ptr != (SubdivMeshNode *)0x0) {
          (*((local_68.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
        }
        (*(pSVar65->super_Node).super_RefCount._vptr_RefCount[3])(pSVar65);
        return;
      }
      pHVar66 = (HairSetNode *)
                __dynamic_cast(pNVar10,&SceneGraph::Node::typeinfo,
                               &SceneGraph::HairSetNode::typeinfo,0);
      if (pHVar66 != (HairSetNode *)0x0) {
        (*(pHVar66->super_Node).super_RefCount._vptr_RefCount[2])(pHVar66);
        BVar62 = (BBox1f)operator_new(0x118);
        local_70.ptr = pHVar66;
        (*(pHVar66->super_Node).super_RefCount._vptr_RefCount[2])(pHVar66);
        SceneGraph::HairSetNode::HairSetNode((HairSetNode *)BVar62,&local_70,spaces);
        local_178._0_8_ = BVar62;
        (**(code **)(*(long *)BVar62 + 0x10))(BVar62);
        std::
        vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
        ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                  (local_130,(Ref<embree::SceneGraph::Node> *)local_178);
        if ((BBox1f)local_178._0_8_ != (BBox1f)0x0) {
          (**(code **)(*(long *)local_178._0_8_ + 0x18))();
        }
        if (local_70.ptr != (HairSetNode *)0x0) {
          (*((local_70.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
        }
        (*(pHVar66->super_Node).super_RefCount._vptr_RefCount[3])(pHVar66);
        return;
      }
      pPVar67 = (PointSetNode *)
                __dynamic_cast(pNVar10,&SceneGraph::Node::typeinfo,
                               &SceneGraph::PointSetNode::typeinfo,0);
      if (pPVar67 == (PointSetNode *)0x0) {
        return;
      }
      (*(pPVar67->super_Node).super_RefCount._vptr_RefCount[2])(pPVar67);
      BVar62 = (BBox1f)operator_new(0xb0);
      local_78.ptr = pPVar67;
      (*(pPVar67->super_Node).super_RefCount._vptr_RefCount[2])(pPVar67);
      SceneGraph::PointSetNode::PointSetNode((PointSetNode *)BVar62,&local_78,spaces);
      local_178._0_8_ = BVar62;
      (**(code **)(*(long *)BVar62 + 0x10))(BVar62);
      std::
      vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
      ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                (local_130,(Ref<embree::SceneGraph::Node> *)local_178);
      if ((BBox1f)local_178._0_8_ != (BBox1f)0x0) {
        (**(code **)(*(long *)local_178._0_8_ + 0x18))();
      }
      if (local_78.ptr != (PointSetNode *)0x0) {
        (*((local_78.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      (*(pPVar67->super_Node).super_RefCount._vptr_RefCount[3])(pPVar67);
      return;
    }
    (**(code **)(*plVar58 + 0x10))(plVar58);
    lVar74 = plVar58[0xd];
    if (plVar58[0xe] != lVar74) {
      local_40 = (Ref<embree::SceneGraph::Node> *)(plVar58 + 0x10);
      uVar72 = 0;
      uVar71 = extraout_RDX_03;
      local_48 = plVar58;
      do {
        puVar73 = (undefined8 *)(uVar72 * 0x30 + lVar74);
        sVar11 = (spaces->spaces).size_active;
        local_38 = uVar72;
        if (sVar11 == 1) {
          fVar79 = (spaces->time_range).lower;
          fVar81 = (spaces->time_range).upper;
          fVar97 = (float)*puVar73;
          fVar123 = (float)((ulong)*puVar73 >> 0x20);
          uVar75 = -(uint)(fVar79 < fVar97);
          uVar77 = -(uint)(fVar81 < fVar123);
          local_178._0_8_ =
               CONCAT44(~uVar77 & (uint)fVar123,~uVar75 & (uint)fVar79) |
               CONCAT44((uint)fVar81 & uVar77,(uint)fVar97 & uVar75);
          sVar11 = puVar73[2];
          pAVar60 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)(local_178 + 0x10);
          local_178._16_8_ = 0;
          sStack_160 = 0;
          local_158 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
          if (sVar11 != 0) {
            pAVar60 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                      alignedMalloc(sVar11 << 6,0x10);
            uVar71 = extraout_RDX_04;
            sStack_160 = sVar11;
            local_158 = pAVar60;
          }
          local_150 = false;
          local_178._16_8_ = sStack_160;
          if (puVar73[2] != 0) {
            lVar74 = 0x30;
            uVar72 = 0;
            local_178._16_8_ = sStack_160;
            do {
              uVar75 = (uint)uVar71;
              pAVar13 = (spaces->spaces).items;
              lVar12 = puVar73[4];
              bVar9 = spaces->quaternion;
              bVar56 = *(byte *)(puVar73 + 5);
              local_150 = false;
              fVar79 = (pAVar13->l).vx.field_0.m128[0];
              uVar6 = *(undefined8 *)((long)&(pAVar13->l).vx.field_0 + 4);
              fVar81 = (float)((ulong)uVar6 >> 0x20);
              local_198 = (float)uVar6;
              if (((((fVar79 != 1.0) || (NAN(fVar79))) || (local_198 != 0.0)) ||
                  ((NAN(local_198) || (fVar81 != 0.0)))) || (NAN(fVar81))) {
LAB_0015f68b:
                uVar6 = *(undefined8 *)(lVar12 + -0x30 + lVar74);
                fVar97 = (float)uVar6;
                fVar123 = (float)((ulong)uVar6 >> 0x20);
                iVar76 = -(uint)(fVar97 != 1.0);
                iVar78 = -(uint)(fVar123 != 0.0);
                auVar85._4_4_ = iVar78;
                auVar85._0_4_ = iVar76;
                auVar85._8_4_ = iVar78;
                auVar85._12_4_ = iVar78;
                auVar84._8_8_ = auVar85._8_8_;
                auVar84._4_4_ = iVar76;
                auVar84._0_4_ = iVar76;
                uVar75 = movmskpd(uVar75,auVar84);
                uVar71 = (ulong)uVar75;
                fVar79 = *(float *)(lVar12 + -0x28 + lVar74);
                if ((uVar75 & 1) == 0) {
                  bVar70 = (byte)uVar75 >> 1;
                  uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
                  uVar71 = (ulong)uVar75;
                  if (((bVar70 == 0) && (fVar79 == 0.0)) && (!NAN(fVar79))) {
                    pfVar1 = (float *)(lVar12 + -0x24 + lVar74);
                    auVar47._4_4_ = -(uint)(pfVar1[1] != 0.0);
                    auVar47._0_4_ = -(uint)(*pfVar1 != 0.0);
                    auVar47._8_4_ = -(uint)(pfVar1[2] != 1.0);
                    auVar47._12_4_ = -(uint)(pfVar1[3] != 0.0);
                    uVar75 = movmskps(uVar75,auVar47);
                    uVar71 = (ulong)uVar75;
                    if ((((bVar56 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                       ((uVar75 & 4) == 0)) {
                      bVar70 = ((byte)uVar75 & 8) >> 3;
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
                      uVar71 = (ulong)uVar75;
                      if (bVar70 == 0) {
                        pfVar1 = (float *)(lVar12 + -0x14 + lVar74);
                        auVar48._4_4_ = -(uint)(pfVar1[1] != 0.0);
                        auVar48._0_4_ = -(uint)(*pfVar1 != 0.0);
                        auVar48._8_4_ = -(uint)(pfVar1[2] != 0.0);
                        auVar48._12_4_ = -(uint)(pfVar1[3] != 1.0);
                        uVar75 = movmskps(uVar75,auVar48);
                        uVar71 = (ulong)uVar75;
                        if ((((bVar56 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                           ((uVar75 & 4) == 0)) {
                          bVar70 = ((byte)uVar75 & 8) >> 3;
                          uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
                          uVar71 = (ulong)uVar75;
                          if (bVar70 == 0) {
                            pfVar1 = (float *)(lVar12 + -4 + lVar74);
                            auVar49._4_4_ = -(uint)(pfVar1[1] != 0.0);
                            auVar49._0_4_ = -(uint)(*pfVar1 != 0.0);
                            auVar49._8_4_ = -(uint)(pfVar1[2] != 0.0);
                            auVar49._12_4_ = -(uint)(pfVar1[3] != 0.0);
                            uVar75 = movmskps(uVar75,auVar49);
                            uVar71 = (ulong)uVar75;
                            if ((((((bVar56 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                                 ((uVar75 & 4) == 0)) &&
                                (bVar70 = ((byte)uVar75 & 8) >> 3,
                                uVar71 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 == 0))
                               && ((bVar56 == 0 ||
                                   ((fVar80 = *(float *)(lVar12 + 0xc + lVar74), fVar80 == 1.0 &&
                                    (!NAN(fVar80))))))) {
                              fVar110 = (pAVar13->l).vx.field_0.m128[0];
                              local_198 = (pAVar13->l).vx.field_0.m128[1];
                              fVar81 = (pAVar13->l).vx.field_0.m128[2];
                              fVar79 = (pAVar13->l).vx.field_0.m128[3];
                              fVar97 = (pAVar13->l).vy.field_0.m128[0];
                              fVar124 = (pAVar13->l).vy.field_0.m128[1];
                              fVar126 = (pAVar13->l).vy.field_0.m128[2];
                              fVar123 = (pAVar13->l).vy.field_0.m128[3];
                              fVar80 = (pAVar13->l).vz.field_0.m128[0];
                              fVar127 = (pAVar13->l).vz.field_0.m128[1];
                              fVar103 = (pAVar13->l).vz.field_0.m128[2];
                              fVar108 = (pAVar13->l).vz.field_0.m128[3];
                              fVar117 = (pAVar13->p).field_0.m128[0];
                              fVar119 = (pAVar13->p).field_0.m128[1];
                              fVar94 = (pAVar13->p).field_0.m128[2];
                              fVar104 = (pAVar13->p).field_0.m128[3];
                              local_150 = bVar9;
                              goto LAB_00160162;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                if ((bVar9 == false) && (bVar56 == 0)) {
                  fVar135 = (pAVar13->l).vx.field_0.m128[0];
                  fVar138 = (pAVar13->l).vx.field_0.m128[1];
                  fVar95 = (pAVar13->l).vx.field_0.m128[2];
                  fVar96 = (pAVar13->l).vx.field_0.m128[3];
                  fVar98 = (pAVar13->l).vy.field_0.m128[0];
                  fVar131 = (pAVar13->l).vy.field_0.m128[1];
                  fVar99 = (pAVar13->l).vy.field_0.m128[2];
                  fVar100 = (pAVar13->l).vy.field_0.m128[3];
                  fVar136 = (pAVar13->l).vz.field_0.m128[0];
                  fVar101 = (pAVar13->l).vz.field_0.m128[1];
                  fVar137 = (pAVar13->l).vz.field_0.m128[2];
                  fVar139 = (pAVar13->l).vz.field_0.m128[3];
                  fVar110 = fVar97 * fVar135 + fVar123 * fVar98 + fVar79 * fVar136;
                  local_198 = fVar97 * fVar138 + fVar123 * fVar131 + fVar79 * fVar101;
                  fVar81 = fVar97 * fVar95 + fVar123 * fVar99 + fVar79 * fVar137;
                  fVar125 = *(float *)(lVar12 + -0x20 + lVar74);
                  fVar128 = *(float *)(lVar12 + -0x1c + lVar74);
                  fVar129 = *(float *)(lVar12 + -0x18 + lVar74);
                  fVar108 = *(float *)(lVar12 + -0x10 + lVar74);
                  fVar117 = *(float *)(lVar12 + -0xc + lVar74);
                  fVar119 = *(float *)(lVar12 + -8 + lVar74);
                  fVar80 = fVar108 * fVar135 + fVar117 * fVar98 + fVar119 * fVar136;
                  fVar127 = fVar108 * fVar138 + fVar117 * fVar131 + fVar119 * fVar101;
                  fVar103 = fVar108 * fVar95 + fVar117 * fVar99 + fVar119 * fVar137;
                  fVar104 = *(float *)(lVar12 + lVar74);
                  fVar124 = *(float *)(lVar12 + 4 + lVar74);
                  fVar126 = *(float *)(lVar12 + 8 + lVar74);
                  fVar108 = fVar108 * fVar96 + fVar117 * fVar100 + fVar119 * fVar139;
                  fVar79 = fVar97 * fVar96 + fVar123 * fVar100 + fVar79 * fVar139;
                  fVar117 = fVar104 * fVar135 + fVar124 * fVar98 + fVar126 * fVar136 +
                            (pAVar13->p).field_0.m128[0];
                  fVar119 = fVar104 * fVar138 + fVar124 * fVar131 + fVar126 * fVar101 +
                            (pAVar13->p).field_0.m128[1];
                  fVar94 = fVar104 * fVar95 + fVar124 * fVar99 + fVar126 * fVar137 +
                           (pAVar13->p).field_0.m128[2];
                  fVar104 = fVar104 * fVar96 + fVar124 * fVar100 + fVar126 * fVar139 +
                            (pAVar13->p).field_0.m128[3];
                  fVar97 = fVar125 * fVar135 + fVar128 * fVar98 + fVar129 * fVar136;
                  fVar124 = fVar125 * fVar138 + fVar128 * fVar131 + fVar129 * fVar101;
                  fVar126 = fVar125 * fVar95 + fVar128 * fVar99 + fVar129 * fVar137;
                  fVar123 = fVar125 * fVar96 + fVar128 * fVar100 + fVar129 * fVar139;
                }
                else if ((bVar9 == false) || (bVar56 == 0)) {
                  if ((bVar9 == false) || (bVar56 != 0)) {
                    if ((local_198 != 0.0) ||
                       ((((NAN(local_198) || (fVar81 != 0.0)) || (NAN(fVar81))) ||
                        (uVar6 = *(undefined8 *)&(pAVar13->l).vz.field_0,
                        auVar30._4_4_ = -(uint)((pAVar13->l).vy.field_0.m128[0] != 0.0),
                        auVar30._0_4_ = -(uint)((pAVar13->l).vy.field_0.m128[2] != 0.0),
                        auVar30._8_4_ = -(uint)((float)uVar6 != 0.0),
                        auVar30._12_4_ = -(uint)((float)((ulong)uVar6 >> 0x20) != 0.0),
                        uVar57 = movmskps((int)CONCAT71((int7)((ulong)pAVar60 >> 8),bVar56),auVar30)
                        , (char)uVar57 != '\0')))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                 ,0x83);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                      std::ostream::put(-0x30);
                      std::ostream::flush();
                      uVar71 = extraout_RDX_07;
                    }
                    pfVar2 = (float *)(lVar12 + -0x30 + lVar74);
                    fVar79 = pfVar2[3];
                    pfVar3 = (float *)(lVar12 + -0x20 + lVar74);
                    fVar97 = *pfVar3;
                    fVar123 = pfVar3[3];
                    pfVar5 = (float *)(lVar12 + -0x10 + lVar74);
                    fVar80 = *pfVar5;
                    fVar127 = pfVar5[1];
                    fVar108 = pfVar5[3];
                    pfVar1 = (float *)(lVar12 + lVar74);
                    fVar117 = *pfVar1;
                    fVar119 = pfVar1[1];
                    fVar94 = pfVar1[2];
                    fVar104 = pfVar1[3];
                    uVar6 = *(undefined8 *)&(pAVar13->p).field_0;
                    fVar110 = (pAVar13->l).vx.field_0.m128[0] * *pfVar2;
                    local_198 = pfVar2[1] + (float)uVar6;
                    fVar81 = pfVar2[2] + (float)((ulong)uVar6 >> 0x20);
                    fVar126 = pfVar3[2] + (pAVar13->p).field_0.m128[2];
                    fVar124 = pfVar3[1] * (pAVar13->l).vy.field_0.m128[1];
                    fVar103 = pfVar5[2] * (pAVar13->l).vz.field_0.m128[2];
                    local_150 = true;
                  }
                  else {
                    local_e8 = ZEXT416((uint)(pAVar13->p).field_0.m128[3]);
                    local_c8 = ZEXT416((uint)(pAVar13->l).vx.field_0.m128[3]);
                    local_b8 = ZEXT416((uint)(pAVar13->l).vy.field_0.m128[3]);
                    local_f8 = ZEXT416((uint)(pAVar13->l).vz.field_0.m128[3]);
                    local_118 = (pAVar13->l).vy.field_0.m128[0];
                    fStack_114 = (pAVar13->l).vy.field_0.m128[1];
                    fStack_d0 = (pAVar13->l).vy.field_0.m128[2];
                    fStack_10c = (pAVar13->l).vy.field_0.m128[3];
                    local_108 = (pAVar13->l).vz.field_0.m128[0];
                    fStack_104 = (pAVar13->l).vz.field_0.m128[1];
                    fStack_100 = (pAVar13->l).vz.field_0.m128[2];
                    fStack_fc = (pAVar13->l).vz.field_0.m128[3];
                    local_98 = (pAVar13->l).vx.field_0.m128[0];
                    fStack_8c = (pAVar13->l).vx.field_0.m128[1];
                    pfVar1 = (float *)(lVar12 + -0x30 + lVar74);
                    fVar79 = *pfVar1;
                    fVar97 = pfVar1[1];
                    fVar123 = pfVar1[2];
                    pfVar1 = (float *)(lVar12 + -0x20 + lVar74);
                    fVar80 = *pfVar1;
                    fVar127 = pfVar1[1];
                    fVar108 = pfVar1[2];
                    puVar4 = (undefined8 *)(lVar12 + -0x10 + lVar74);
                    local_128 = *puVar4;
                    uStack_120 = puVar4[1];
                    pfVar1 = (float *)(lVar12 + lVar74);
                    fVar117 = *pfVar1;
                    fVar119 = pfVar1[1];
                    fVar94 = pfVar1[2];
                    fVar110 = fVar79 * local_98 + fVar97 * local_118 + fVar123 * local_108;
                    fVar104 = fVar79 * 0.0 + fVar97 * fStack_114 + fVar123 * fStack_104;
                    fVar79 = fVar79 * 0.0 + fVar97 * 0.0 + fVar123 * fStack_100;
                    local_148 = fVar80 * local_98 + fVar127 * local_118 + fVar108 * local_108;
                    fStack_144 = fVar80 * 0.0 + fVar127 * fStack_114 + fVar108 * fStack_104;
                    fStack_140 = fVar80 * 0.0 + fVar127 * 0.0 + fVar108 * fStack_100;
                    fStack_13c = fVar80 * fStack_8c + fVar127 * fStack_10c + fVar108 * fStack_fc;
                    fStack_110 = 0.0;
                    fStack_94 = 0.0;
                    fStack_90 = 0.0;
                    local_a8._0_4_ =
                         fVar117 * local_98 + fVar119 * local_118 + fVar94 * local_108 +
                         (pAVar13->p).field_0.m128[0];
                    local_a8._4_4_ =
                         fVar117 * 0.0 + fVar119 * fStack_114 + fVar94 * fStack_104 +
                         (pAVar13->p).field_0.m128[1];
                    fStack_a0 = fVar117 * 0.0 + fVar119 * 0.0 + fVar94 * fStack_100 +
                                (pAVar13->p).field_0.m128[2];
                    register0x0000128c =
                         fVar117 * fStack_8c + fVar119 * fStack_10c + fVar94 * fStack_fc +
                         (pAVar13->p).field_0.m128[3];
                    local_d8 = local_118;
                    fStack_d4 = fStack_114;
                    fStack_cc = fStack_10c;
                    if ((((fVar104 != 0.0) || (NAN(fVar104))) ||
                        ((fVar79 != 0.0 || ((NAN(fVar79) || (fStack_140 != 0.0)))))) ||
                       (NAN(fStack_140))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                 ,0x61);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                      std::ostream::put(-0x30);
                      std::ostream::flush();
                      uVar71 = extraout_RDX_06;
                    }
                    fVar80 = local_98 * (float)local_128 +
                             local_118 * local_128._4_4_ + local_108 * (float)uStack_120;
                    fVar127 = fStack_94 * (float)local_128 +
                              fStack_114 * local_128._4_4_ + fStack_104 * (float)uStack_120;
                    fVar103 = fStack_90 * (float)local_128 +
                              fStack_110 * local_128._4_4_ + fStack_100 * (float)uStack_120;
                    local_150 = true;
                    fVar108 = (float)local_f8._0_4_;
                    fVar79 = (float)local_c8._0_4_;
                    fVar117 = (float)local_a8._0_4_;
                    fVar119 = (float)local_a8._4_4_;
                    fVar94 = fStack_a0;
                    fVar104 = (float)local_e8._0_4_;
                    fVar97 = local_148;
                    fVar124 = fStack_144;
                    fVar126 = fStack_d0;
                    fVar123 = (float)local_b8._0_4_;
                  }
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                             ,0x67);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                  std::ostream::put(-0x30);
                  std::ostream::flush();
                  fVar79 = (pAVar13->p).field_0.m128[3];
                  fVar81 = (pAVar13->l).vx.field_0.m128[3];
                  fVar97 = (pAVar13->l).vy.field_0.m128[3];
                  fVar123 = (pAVar13->l).vz.field_0.m128[3];
                  aVar7 = (pAVar13->l).vx.field_0.field_1;
                  fVar80 = (pAVar13->l).vy.field_0.m128[0];
                  fVar127 = (pAVar13->l).vy.field_0.m128[1];
                  fVar108 = (pAVar13->l).vz.field_0.m128[0];
                  fVar117 = (pAVar13->l).vz.field_0.m128[1];
                  fVar119 = (pAVar13->l).vz.field_0.m128[2];
                  fVar129 = fVar81 * fVar97 + fVar79 * fVar123;
                  fVar110 = fVar81 * fVar97 - fVar79 * fVar123;
                  fVar103 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                            -fVar123 * fVar123;
                  fVar125 = fVar79 * fVar79 - fVar81 * fVar81;
                  fVar128 = fVar97 * fVar97 + fVar125 + -fVar123 * fVar123;
                  fVar138 = fVar81 * fVar123 - fVar79 * fVar97;
                  fVar94 = fVar79 * fVar97 + fVar81 * fVar123;
                  fVar135 = fVar97 * fVar123 + fVar79 * fVar81;
                  fVar79 = fVar97 * fVar123 - fVar79 * fVar81;
                  fVar104 = (pAVar13->p).field_0.m128[0];
                  fVar124 = (pAVar13->p).field_0.m128[1];
                  fVar126 = (pAVar13->p).field_0.m128[2];
                  fVar129 = fVar129 + fVar129;
                  fVar138 = fVar138 + fVar138;
                  fVar110 = fVar110 + fVar110;
                  fVar135 = fVar135 + fVar135;
                  fVar94 = fVar94 + fVar94;
                  fVar79 = fVar79 + fVar79;
                  fVar81 = fVar123 * fVar123 + fVar125 + -fVar97 * fVar97;
                  fVar111 = fVar103 * 1.0 + fVar129 * 0.0 + fVar138 * 0.0;
                  fVar113 = fVar103 * 0.0 + fVar129 * 1.0 + fVar138 * 0.0;
                  fVar115 = fVar103 * 0.0 + fVar129 * 0.0 + fVar138 * 1.0;
                  fVar116 = fVar103 * 0.0 + fVar129 * 0.0 + fVar138 * 0.0;
                  fVar105 = fVar110 * 1.0 + fVar128 * 0.0 + fVar135 * 0.0;
                  fVar106 = fVar110 * 0.0 + fVar128 * 1.0 + fVar135 * 0.0;
                  fVar107 = fVar110 * 0.0 + fVar128 * 0.0 + fVar135 * 1.0;
                  fVar109 = fVar110 * 0.0 + fVar128 * 0.0 + fVar135 * 0.0;
                  fVar125 = fVar94 * 1.0 + fVar79 * 0.0 + fVar81 * 0.0;
                  fVar129 = fVar94 * 0.0 + fVar79 * 1.0 + fVar81 * 0.0;
                  fVar138 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 1.0;
                  fVar96 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 0.0;
                  local_188 = aVar7.y;
                  fStack_184 = aVar7.z;
                  local_198 = aVar7.x;
                  fVar130 = local_198 * fVar111 + fVar105 * 0.0 + fVar125 * 0.0;
                  fVar132 = local_198 * fVar113 + fVar106 * 0.0 + fVar129 * 0.0;
                  fVar133 = local_198 * fVar115 + fVar107 * 0.0 + fVar138 * 0.0;
                  fVar134 = local_198 * fVar116 + fVar109 * 0.0 + fVar96 * 0.0;
                  fVar128 = fVar80 * fVar111 + fVar127 * fVar105 + fVar125 * 0.0;
                  fVar135 = fVar80 * fVar113 + fVar127 * fVar106 + fVar129 * 0.0;
                  fVar95 = fVar80 * fVar115 + fVar127 * fVar107 + fVar138 * 0.0;
                  fVar98 = fVar80 * fVar116 + fVar127 * fVar109 + fVar96 * 0.0;
                  local_148 = fVar108 * fVar111 + fVar117 * fVar105 + fVar119 * fVar125;
                  fStack_144 = fVar108 * fVar113 + fVar117 * fVar106 + fVar119 * fVar129;
                  fStack_140 = fVar108 * fVar115 + fVar117 * fVar107 + fVar119 * fVar138;
                  fStack_13c = fVar108 * fVar116 + fVar117 * fVar109 + fVar119 * fVar96;
                  fVar79 = *(float *)(lVar12 + 0xc + lVar74);
                  fVar81 = *(float *)(lVar12 + -0x24 + lVar74);
                  fVar97 = *(float *)(lVar12 + -0x14 + lVar74);
                  fVar123 = *(float *)(lVar12 + -4 + lVar74);
                  fVar131 = fVar81 * fVar97 + fVar79 * fVar123;
                  fVar110 = fVar81 * fVar97 - fVar79 * fVar123;
                  fVar103 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                            -fVar123 * fVar123;
                  fVar127 = fVar79 * fVar79 - fVar81 * fVar81;
                  fVar137 = fVar97 * fVar97 + fVar127 + -fVar123 * fVar123;
                  fVar136 = fVar81 * fVar123 - fVar79 * fVar97;
                  fVar101 = fVar79 * fVar97 + fVar81 * fVar123;
                  fVar139 = fVar97 * fVar123 + fVar79 * fVar81;
                  fVar94 = fVar97 * fVar123 - fVar79 * fVar81;
                  pfVar2 = (float *)(lVar12 + -0x30 + lVar74);
                  fVar79 = *pfVar2;
                  pfVar3 = (float *)(lVar12 + -0x20 + lVar74);
                  fVar81 = *pfVar3;
                  fVar80 = pfVar3[1];
                  fVar120 = fVar123 * fVar123 + fVar127 + -fVar97 * fVar97;
                  pfVar1 = (float *)(lVar12 + -0x10 + lVar74);
                  fVar97 = *pfVar1;
                  fVar123 = pfVar1[1];
                  fVar127 = pfVar1[2];
                  fVar131 = fVar131 + fVar131;
                  fVar136 = fVar136 + fVar136;
                  pfVar1 = (float *)(lVar12 + lVar74);
                  fVar108 = *pfVar1;
                  fVar117 = pfVar1[1];
                  fVar119 = pfVar1[2];
                  fVar99 = fVar103 * 1.0 + fVar131 * 0.0 + fVar136 * 0.0;
                  fVar100 = fVar103 * 0.0 + fVar131 * 1.0 + fVar136 * 0.0;
                  fVar136 = fVar103 * 0.0 + fVar131 * 0.0 + fVar136 * 1.0;
                  fVar110 = fVar110 + fVar110;
                  fVar139 = fVar139 + fVar139;
                  fVar101 = fVar101 + fVar101;
                  fVar94 = fVar94 + fVar94;
                  fVar103 = fVar110 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
                  fVar131 = fVar110 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
                  fVar110 = fVar110 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
                  fVar137 = fVar101 * 1.0 + fVar94 * 0.0 + fVar120 * 0.0;
                  fVar139 = fVar101 * 0.0 + fVar94 * 1.0 + fVar120 * 0.0;
                  fVar94 = fVar101 * 0.0 + fVar94 * 0.0 + fVar120 * 1.0;
                  fVar112 = fVar79 * fVar99 + fVar103 * 0.0 + fVar137 * 0.0;
                  fVar114 = fVar79 * fVar100 + fVar131 * 0.0 + fVar139 * 0.0;
                  fVar79 = fVar79 * fVar136 + fVar110 * 0.0 + fVar94 * 0.0;
                  fVar101 = fVar81 * fVar99 + fVar80 * fVar103 + fVar137 * 0.0;
                  fVar120 = fVar81 * fVar100 + fVar80 * fVar131 + fVar139 * 0.0;
                  fVar102 = fVar81 * fVar136 + fVar80 * fVar110 + fVar94 * 0.0;
                  fVar118 = fVar97 * fVar99 + fVar123 * fVar103 + fVar127 * fVar137;
                  fVar121 = fVar97 * fVar100 + fVar123 * fVar131 + fVar127 * fVar139;
                  fVar122 = fVar97 * fVar136 + fVar123 * fVar110 + fVar127 * fVar94;
                  fVar97 = fVar108 * fVar99 + fVar117 * fVar103 + fVar119 * fVar137 +
                           pfVar2[1] + 0.0;
                  fVar123 = fVar108 * fVar100 + fVar117 * fVar131 + fVar119 * fVar139 +
                            pfVar2[2] + 0.0;
                  fVar131 = fVar108 * fVar136 + fVar117 * fVar110 + fVar119 * fVar94 +
                            pfVar3[2] + 0.0;
                  fVar110 = fVar112 * fVar130 + fVar114 * fVar128 + fVar79 * local_148;
                  local_198 = fVar112 * fVar132 + fVar114 * fVar135 + fVar79 * fStack_144;
                  fVar81 = fVar112 * fVar133 + fVar114 * fVar95 + fVar79 * fStack_140;
                  fVar80 = fVar118 * fVar130 + fVar121 * fVar128 + fVar122 * local_148;
                  fVar127 = fVar118 * fVar132 + fVar121 * fVar135 + fVar122 * fStack_144;
                  fVar103 = fVar118 * fVar133 + fVar121 * fVar95 + fVar122 * fStack_140;
                  uVar71 = extraout_RDX_05;
                  fVar108 = fVar118 * fVar134 + fVar121 * fVar98 + fVar122 * fStack_13c;
                  fVar79 = fVar112 * fVar134 + fVar114 * fVar98 + fVar79 * fStack_13c;
                  fVar117 = fVar97 * fVar130 + fVar123 * fVar128 + fVar131 * local_148 +
                            fVar104 * fVar111 + fVar124 * fVar105 + fVar126 * fVar125 +
                            local_188 + 0.0;
                  fVar119 = fVar97 * fVar132 + fVar123 * fVar135 + fVar131 * fStack_144 +
                            fVar104 * fVar113 + fVar124 * fVar106 + fVar126 * fVar129 +
                            fStack_184 + 0.0;
                  fVar94 = fVar97 * fVar133 + fVar123 * fVar95 + fVar131 * fStack_140 +
                           fVar104 * fVar115 + fVar124 * fVar107 + fVar126 * fVar138 +
                           (pAVar13->l).vy.field_0.m128[2] + 0.0;
                  fVar104 = fVar97 * fVar134 + fVar123 * fVar98 + fVar131 * fStack_13c +
                            fVar104 * fVar116 + fVar124 * fVar109 + fVar126 * fVar96 + 0.0;
                  fVar97 = fVar101 * fVar130 + fVar120 * fVar128 + fVar102 * local_148;
                  fVar124 = fVar101 * fVar132 + fVar120 * fVar135 + fVar102 * fStack_144;
                  fVar126 = fVar101 * fVar133 + fVar120 * fVar95 + fVar102 * fStack_140;
                  fVar123 = fVar101 * fVar134 + fVar120 * fVar98 + fVar102 * fStack_13c;
                }
              }
              else {
                auVar27._4_4_ = -(uint)((pAVar13->l).vy.field_0.m128[0] != 0.0);
                auVar27._0_4_ = -(uint)((pAVar13->l).vx.field_0.m128[3] != 0.0);
                auVar27._8_4_ = -(uint)((pAVar13->l).vy.field_0.m128[1] != 1.0);
                auVar27._12_4_ = -(uint)((pAVar13->l).vy.field_0.m128[2] != 0.0);
                uVar75 = movmskps(uVar75,auVar27);
                if ((((bVar9 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                   (((uVar75 & 4) != 0 ||
                    (bVar70 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70)
                    , bVar70 != 0)))) goto LAB_0015f68b;
                auVar28._4_4_ = -(uint)((pAVar13->l).vz.field_0.m128[0] != 0.0);
                auVar28._0_4_ = -(uint)((pAVar13->l).vy.field_0.m128[3] != 0.0);
                auVar28._8_4_ = -(uint)((pAVar13->l).vz.field_0.m128[1] != 0.0);
                auVar28._12_4_ = -(uint)((pAVar13->l).vz.field_0.m128[2] != 1.0);
                uVar75 = movmskps(uVar75,auVar28);
                if (((((bVar9 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0))
                   || (bVar70 = ((byte)uVar75 & 8) >> 3,
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 != 0))
                goto LAB_0015f68b;
                auVar29._4_4_ = -(uint)((pAVar13->p).field_0.m128[0] != 0.0);
                auVar29._0_4_ = -(uint)((pAVar13->l).vz.field_0.m128[3] != 0.0);
                auVar29._8_4_ = -(uint)((pAVar13->p).field_0.m128[1] != 0.0);
                auVar29._12_4_ = -(uint)((pAVar13->p).field_0.m128[2] != 0.0);
                uVar75 = movmskps(uVar75,auVar29);
                if ((((bVar9 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0))
                goto LAB_0015f68b;
                bVar70 = ((byte)uVar75 & 8) >> 3;
                uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
                uVar71 = (ulong)uVar75;
                if ((bVar70 != 0) ||
                   ((bVar9 != false &&
                    ((fVar79 = (pAVar13->p).field_0.m128[3], fVar79 != 1.0 || (NAN(fVar79)))))))
                goto LAB_0015f68b;
                pfVar1 = (float *)(lVar12 + -0x30 + lVar74);
                fVar110 = *pfVar1;
                local_198 = pfVar1[1];
                fVar81 = pfVar1[2];
                fVar79 = pfVar1[3];
                pfVar1 = (float *)(lVar12 + -0x20 + lVar74);
                fVar97 = *pfVar1;
                fVar124 = pfVar1[1];
                fVar126 = pfVar1[2];
                fVar123 = pfVar1[3];
                pfVar1 = (float *)(lVar12 + -0x10 + lVar74);
                fVar80 = *pfVar1;
                fVar127 = pfVar1[1];
                fVar103 = pfVar1[2];
                fVar108 = pfVar1[3];
                pfVar1 = (float *)(lVar12 + lVar74);
                fVar117 = *pfVar1;
                fVar119 = pfVar1[1];
                fVar94 = pfVar1[2];
                fVar104 = pfVar1[3];
                local_150 = (bool)bVar56;
              }
LAB_00160162:
              pfVar1 = (float *)((long)local_158 + lVar74 + -0x30);
              *pfVar1 = fVar110;
              pfVar1[1] = local_198;
              pfVar1[2] = fVar81;
              pfVar1[3] = fVar79;
              pfVar1 = (float *)((long)local_158 + lVar74 + -0x20);
              *pfVar1 = fVar97;
              pfVar1[1] = fVar124;
              pfVar1[2] = fVar126;
              pfVar1[3] = fVar123;
              pfVar1 = (float *)((long)local_158 + lVar74 + -0x10);
              *pfVar1 = fVar80;
              pfVar1[1] = fVar127;
              pfVar1[2] = fVar103;
              pfVar1[3] = fVar108;
              pfVar1 = (float *)((long)&(local_158->l).vx.field_0 + lVar74);
              *pfVar1 = fVar117;
              pfVar1[1] = fVar119;
              pfVar1[2] = fVar94;
              pfVar1[3] = fVar104;
              uVar72 = uVar72 + 1;
              lVar74 = lVar74 + 0x40;
              pAVar60 = local_158;
            } while (uVar72 < (ulong)puVar73[2]);
          }
        }
        else if (puVar73[2] == 1) {
          fVar79 = (spaces->time_range).lower;
          fVar81 = (spaces->time_range).upper;
          fVar97 = (float)*puVar73;
          fVar123 = (float)((ulong)*puVar73 >> 0x20);
          uVar75 = -(uint)(fVar79 < fVar97);
          uVar77 = -(uint)(fVar81 < fVar123);
          local_178._0_8_ =
               CONCAT44(~uVar77 & (uint)fVar123,~uVar75 & (uint)fVar79) |
               CONCAT44((uint)fVar81 & uVar77,(uint)fVar97 & uVar75);
          local_178._16_8_ = 0;
          sStack_160 = 0;
          local_158 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
          if (sVar11 == 0) {
LAB_00161b60:
            local_158 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            sStack_160 = 0;
            local_178._16_8_ = 0;
            local_150 = true;
            if (spaces->quaternion == false) {
              local_150 = SUB41(*(undefined4 *)(puVar73 + 5),0);
            }
          }
          else {
            local_158 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                        alignedMalloc(sVar11 << 6,0x10);
            pAVar60 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                      (spaces->spaces).size_active;
            local_150 = true;
            if (spaces->quaternion == false) {
              local_150 = SUB41(*(undefined4 *)(puVar73 + 5),0);
            }
            local_178._16_8_ = sVar11;
            sStack_160 = sVar11;
            if (pAVar60 != (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0) {
              lVar74 = 0x30;
              uVar72 = 0;
              uVar71 = extraout_RDX_08;
              do {
                uVar75 = (uint)uVar71;
                pAVar13 = (spaces->spaces).items;
                pfVar1 = (float *)puVar73[4];
                bVar9 = spaces->quaternion;
                bVar56 = *(byte *)(puVar73 + 5);
                local_150 = false;
                fVar79 = *(float *)((long)pAVar13 + lVar74 + -0x30);
                uVar6 = *(undefined8 *)((long)pAVar13 + lVar74 + -0x2c);
                fVar81 = (float)((ulong)uVar6 >> 0x20);
                local_198 = (float)uVar6;
                if (((((fVar79 != 1.0) || (NAN(fVar79))) || (local_198 != 0.0)) ||
                    ((NAN(local_198) || (fVar81 != 0.0)))) || (NAN(fVar81))) {
LAB_00160368:
                  fVar97 = (float)*(undefined8 *)pfVar1;
                  fVar123 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
                  iVar76 = -(uint)(fVar97 != 1.0);
                  iVar78 = -(uint)(fVar123 != 0.0);
                  auVar87._4_4_ = iVar78;
                  auVar87._0_4_ = iVar76;
                  auVar87._8_4_ = iVar78;
                  auVar87._12_4_ = iVar78;
                  auVar86._8_8_ = auVar87._8_8_;
                  auVar86._4_4_ = iVar76;
                  auVar86._0_4_ = iVar76;
                  uVar75 = movmskpd(uVar75,auVar86);
                  uVar71 = (ulong)uVar75;
                  fVar79 = pfVar1[2];
                  if ((uVar75 & 1) == 0) {
                    bVar70 = (byte)uVar75 >> 1;
                    uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
                    uVar71 = (ulong)uVar75;
                    if (((bVar70 == 0) && (fVar79 == 0.0)) && (!NAN(fVar79))) {
                      auVar50._4_4_ = -(uint)(pfVar1[4] != 0.0);
                      auVar50._0_4_ = -(uint)(pfVar1[3] != 0.0);
                      auVar50._8_4_ = -(uint)(pfVar1[5] != 1.0);
                      auVar50._12_4_ = -(uint)(pfVar1[6] != 0.0);
                      uVar75 = movmskps(uVar75,auVar50);
                      uVar71 = (ulong)uVar75;
                      if ((((bVar56 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                         ((uVar75 & 4) == 0)) {
                        bVar70 = ((byte)uVar75 & 8) >> 3;
                        uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
                        uVar71 = (ulong)uVar75;
                        if (bVar70 == 0) {
                          auVar51._4_4_ = -(uint)(pfVar1[8] != 0.0);
                          auVar51._0_4_ = -(uint)(pfVar1[7] != 0.0);
                          auVar51._8_4_ = -(uint)(pfVar1[9] != 0.0);
                          auVar51._12_4_ = -(uint)(pfVar1[10] != 1.0);
                          uVar75 = movmskps(uVar75,auVar51);
                          uVar71 = (ulong)uVar75;
                          if ((((bVar56 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                             ((uVar75 & 4) == 0)) {
                            bVar70 = ((byte)uVar75 & 8) >> 3;
                            uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
                            uVar71 = (ulong)uVar75;
                            if (bVar70 == 0) {
                              auVar52._4_4_ = -(uint)(pfVar1[0xc] != 0.0);
                              auVar52._0_4_ = -(uint)(pfVar1[0xb] != 0.0);
                              auVar52._8_4_ = -(uint)(pfVar1[0xd] != 0.0);
                              auVar52._12_4_ = -(uint)(pfVar1[0xe] != 0.0);
                              uVar75 = movmskps(uVar75,auVar52);
                              uVar71 = (ulong)uVar75;
                              if (((((bVar56 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                                  ((uVar75 & 4) == 0)) &&
                                 ((bVar70 = ((byte)uVar75 & 8) >> 3,
                                  uVar71 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 == 0
                                  && ((bVar56 == 0 || ((pfVar1[0xf] == 1.0 && (!NAN(pfVar1[0xf])))))
                                     )))) {
                                pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x30);
                                fVar110 = *pfVar1;
                                local_198 = pfVar1[1];
                                fVar81 = pfVar1[2];
                                fVar79 = pfVar1[3];
                                pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x20);
                                fVar97 = *pfVar1;
                                fVar124 = pfVar1[1];
                                fVar126 = pfVar1[2];
                                fVar123 = pfVar1[3];
                                pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x10);
                                fVar80 = *pfVar1;
                                fVar127 = pfVar1[1];
                                fVar103 = pfVar1[2];
                                fVar108 = pfVar1[3];
                                pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                                fVar117 = *pfVar1;
                                fVar119 = pfVar1[1];
                                fVar94 = pfVar1[2];
                                fVar104 = pfVar1[3];
                                local_150 = bVar9;
                                goto LAB_00160e3c;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  if ((bVar9 == false) && (bVar56 == 0)) {
                    pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x30);
                    fVar135 = *pfVar2;
                    fVar138 = pfVar2[1];
                    fVar95 = pfVar2[2];
                    fVar96 = pfVar2[3];
                    pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x20);
                    fVar98 = *pfVar2;
                    fVar131 = pfVar2[1];
                    fVar99 = pfVar2[2];
                    fVar100 = pfVar2[3];
                    pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x10);
                    fVar136 = *pfVar2;
                    fVar101 = pfVar2[1];
                    fVar137 = pfVar2[2];
                    fVar139 = pfVar2[3];
                    fVar110 = fVar97 * fVar135 + fVar123 * fVar98 + fVar79 * fVar136;
                    local_198 = fVar97 * fVar138 + fVar123 * fVar131 + fVar79 * fVar101;
                    fVar81 = fVar97 * fVar95 + fVar123 * fVar99 + fVar79 * fVar137;
                    fVar125 = pfVar1[4];
                    fVar128 = pfVar1[5];
                    fVar129 = pfVar1[6];
                    fVar108 = pfVar1[8];
                    fVar117 = pfVar1[9];
                    fVar119 = pfVar1[10];
                    fVar80 = fVar108 * fVar135 + fVar117 * fVar98 + fVar119 * fVar136;
                    fVar127 = fVar108 * fVar138 + fVar117 * fVar131 + fVar119 * fVar101;
                    fVar103 = fVar108 * fVar95 + fVar117 * fVar99 + fVar119 * fVar137;
                    fVar104 = pfVar1[0xc];
                    fVar124 = pfVar1[0xd];
                    fVar126 = pfVar1[0xe];
                    pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                    fVar108 = fVar108 * fVar96 + fVar117 * fVar100 + fVar119 * fVar139;
                    fVar79 = fVar97 * fVar96 + fVar123 * fVar100 + fVar79 * fVar139;
                    fVar117 = fVar104 * fVar135 + fVar124 * fVar98 + fVar126 * fVar136 + *pfVar1;
                    fVar119 = fVar104 * fVar138 + fVar124 * fVar131 + fVar126 * fVar101 + pfVar1[1];
                    fVar94 = fVar104 * fVar95 + fVar124 * fVar99 + fVar126 * fVar137 + pfVar1[2];
                    fVar104 = fVar104 * fVar96 + fVar124 * fVar100 + fVar126 * fVar139 + pfVar1[3];
                    fVar97 = fVar125 * fVar135 + fVar128 * fVar98 + fVar129 * fVar136;
                    fVar124 = fVar125 * fVar138 + fVar128 * fVar131 + fVar129 * fVar101;
                    fVar126 = fVar125 * fVar95 + fVar128 * fVar99 + fVar129 * fVar137;
                    fVar123 = fVar125 * fVar96 + fVar128 * fVar100 + fVar129 * fVar139;
                  }
                  else if ((bVar9 == false) || (bVar56 == 0)) {
                    if ((bVar9 == false) || (bVar56 != 0)) {
                      if ((local_198 != 0.0) ||
                         ((((NAN(local_198) || (fVar81 != 0.0)) || (NAN(fVar81))) ||
                          (uVar6 = *(undefined8 *)((long)pAVar13 + lVar74 + -0x10),
                          auVar34._4_4_ = -(uint)(*(float *)((long)pAVar13 + lVar74 + -0x20) != 0.0)
                          , auVar34._0_4_ =
                                 -(uint)(*(float *)((long)pAVar13 + lVar74 + -0x18) != 0.0),
                          auVar34._8_4_ = -(uint)((float)uVar6 != 0.0),
                          auVar34._12_4_ = -(uint)((float)((ulong)uVar6 >> 0x20) != 0.0),
                          uVar57 = movmskps((int)CONCAT71((int7)((ulong)pAVar60 >> 8),bVar56),
                                            auVar34), (char)uVar57 != '\0')))) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                   ,0x83);
                        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                        std::ostream::put(-0x30);
                        std::ostream::flush();
                        uVar71 = extraout_RDX_11;
                      }
                      fVar79 = pfVar1[3];
                      fVar97 = pfVar1[4];
                      fVar123 = pfVar1[7];
                      fVar80 = pfVar1[8];
                      fVar127 = pfVar1[9];
                      fVar108 = pfVar1[0xb];
                      fVar117 = pfVar1[0xc];
                      fVar119 = pfVar1[0xd];
                      fVar94 = pfVar1[0xe];
                      fVar104 = pfVar1[0xf];
                      uVar6 = *(undefined8 *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                      fVar110 = *(float *)((long)pAVar13 + lVar74 + -0x30) * *pfVar1;
                      local_198 = pfVar1[1] + (float)uVar6;
                      fVar81 = pfVar1[2] + (float)((ulong)uVar6 >> 0x20);
                      fVar126 = pfVar1[6] + *(float *)((long)&(pAVar13->l).vx.field_0 + lVar74 + 8);
                      fVar124 = pfVar1[5] * *(float *)((long)pAVar13 + lVar74 + -0x1c);
                      fVar103 = pfVar1[10] * *(float *)((long)pAVar13 + lVar74 + -8);
                      local_150 = true;
                    }
                    else {
                      local_e8 = ZEXT416(*(uint *)((long)&(pAVar13->l).vx.field_0 + lVar74 + 0xc));
                      local_c8 = ZEXT416(*(uint *)((long)pAVar13 + lVar74 + -0x24));
                      local_b8 = ZEXT416(*(uint *)((long)pAVar13 + lVar74 + -0x14));
                      local_f8 = ZEXT416(*(uint *)((long)pAVar13 + lVar74 + -4));
                      pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x20);
                      local_118 = *pfVar2;
                      fStack_114 = pfVar2[1];
                      fStack_d0 = pfVar2[2];
                      fStack_10c = pfVar2[3];
                      pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x10);
                      local_108 = *pfVar2;
                      fStack_104 = pfVar2[1];
                      fStack_100 = pfVar2[2];
                      fStack_fc = pfVar2[3];
                      pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x30);
                      local_98 = *pfVar2;
                      fStack_8c = pfVar2[1];
                      fVar79 = *pfVar1;
                      fVar97 = pfVar1[1];
                      fVar123 = pfVar1[2];
                      fVar80 = pfVar1[4];
                      fVar127 = pfVar1[5];
                      fVar108 = pfVar1[6];
                      local_128 = *(undefined8 *)(pfVar1 + 8);
                      uStack_120 = *(undefined8 *)(pfVar1 + 10);
                      fVar117 = pfVar1[0xc];
                      fVar119 = pfVar1[0xd];
                      fVar94 = pfVar1[0xe];
                      fVar110 = fVar79 * local_98 + fVar97 * local_118 + fVar123 * local_108;
                      fVar104 = fVar79 * 0.0 + fVar97 * fStack_114 + fVar123 * fStack_104;
                      fVar79 = fVar79 * 0.0 + fVar97 * 0.0 + fVar123 * fStack_100;
                      local_148 = fVar80 * local_98 + fVar127 * local_118 + fVar108 * local_108;
                      fStack_144 = fVar80 * 0.0 + fVar127 * fStack_114 + fVar108 * fStack_104;
                      fStack_140 = fVar80 * 0.0 + fVar127 * 0.0 + fVar108 * fStack_100;
                      fStack_13c = fVar80 * fStack_8c + fVar127 * fStack_10c + fVar108 * fStack_fc;
                      fStack_110 = 0.0;
                      fStack_94 = 0.0;
                      fStack_90 = 0.0;
                      pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                      local_a8._0_4_ =
                           fVar117 * local_98 + fVar119 * local_118 + fVar94 * local_108 + *pfVar1;
                      local_a8._4_4_ =
                           fVar117 * 0.0 + fVar119 * fStack_114 + fVar94 * fStack_104 + pfVar1[1];
                      fStack_a0 = fVar117 * 0.0 + fVar119 * 0.0 + fVar94 * fStack_100 + pfVar1[2];
                      register0x0000128c =
                           fVar117 * fStack_8c + fVar119 * fStack_10c + fVar94 * fStack_fc +
                           pfVar1[3];
                      local_d8 = local_118;
                      fStack_d4 = fStack_114;
                      fStack_cc = fStack_10c;
                      if ((((fVar104 != 0.0) || (NAN(fVar104))) ||
                          ((fVar79 != 0.0 || ((NAN(fVar79) || (fStack_140 != 0.0)))))) ||
                         (NAN(fStack_140))) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                   ,0x61);
                        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                        std::ostream::put(-0x30);
                        std::ostream::flush();
                        uVar71 = extraout_RDX_10;
                      }
                      fVar80 = local_98 * (float)local_128 +
                               local_118 * local_128._4_4_ + local_108 * (float)uStack_120;
                      fVar127 = fStack_94 * (float)local_128 +
                                fStack_114 * local_128._4_4_ + fStack_104 * (float)uStack_120;
                      fVar103 = fStack_90 * (float)local_128 +
                                fStack_110 * local_128._4_4_ + fStack_100 * (float)uStack_120;
                      local_150 = true;
                      fVar108 = (float)local_f8._0_4_;
                      fVar79 = (float)local_c8._0_4_;
                      fVar117 = (float)local_a8._0_4_;
                      fVar119 = (float)local_a8._4_4_;
                      fVar94 = fStack_a0;
                      fVar104 = (float)local_e8._0_4_;
                      fVar97 = local_148;
                      fVar124 = fStack_144;
                      fVar126 = fStack_d0;
                      fVar123 = (float)local_b8._0_4_;
                    }
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                               ,0x67);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                    std::ostream::put(-0x30);
                    std::ostream::flush();
                    fVar79 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar74 + 0xc);
                    fVar81 = *(float *)((long)pAVar13 + lVar74 + -0x24);
                    fVar97 = *(float *)((long)pAVar13 + lVar74 + -0x14);
                    fVar123 = *(float *)((long)pAVar13 + lVar74 + -4);
                    auVar8 = *(undefined1 (*) [16])((long)pAVar13 + lVar74 + -0x30);
                    pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x20);
                    fVar80 = *pfVar2;
                    fVar127 = pfVar2[1];
                    pfVar3 = (float *)((long)pAVar13 + lVar74 + -0x10);
                    fVar108 = *pfVar3;
                    fVar117 = pfVar3[1];
                    fVar119 = pfVar3[2];
                    fVar129 = fVar81 * fVar97 + fVar79 * fVar123;
                    fVar110 = fVar81 * fVar97 - fVar79 * fVar123;
                    fVar103 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                              -fVar123 * fVar123;
                    fVar125 = fVar79 * fVar79 - fVar81 * fVar81;
                    fVar128 = fVar97 * fVar97 + fVar125 + -fVar123 * fVar123;
                    fVar138 = fVar81 * fVar123 - fVar79 * fVar97;
                    fVar94 = fVar79 * fVar97 + fVar81 * fVar123;
                    fVar135 = fVar97 * fVar123 + fVar79 * fVar81;
                    fVar79 = fVar97 * fVar123 - fVar79 * fVar81;
                    pfVar3 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                    fVar104 = *pfVar3;
                    fVar124 = pfVar3[1];
                    fVar126 = pfVar3[2];
                    fVar129 = fVar129 + fVar129;
                    fVar138 = fVar138 + fVar138;
                    fVar110 = fVar110 + fVar110;
                    fVar135 = fVar135 + fVar135;
                    fVar94 = fVar94 + fVar94;
                    fVar79 = fVar79 + fVar79;
                    fVar81 = fVar123 * fVar123 + fVar125 + -fVar97 * fVar97;
                    fVar111 = fVar103 * 1.0 + fVar129 * 0.0 + fVar138 * 0.0;
                    fVar113 = fVar103 * 0.0 + fVar129 * 1.0 + fVar138 * 0.0;
                    fVar115 = fVar103 * 0.0 + fVar129 * 0.0 + fVar138 * 1.0;
                    fVar116 = fVar103 * 0.0 + fVar129 * 0.0 + fVar138 * 0.0;
                    fVar105 = fVar110 * 1.0 + fVar128 * 0.0 + fVar135 * 0.0;
                    fVar106 = fVar110 * 0.0 + fVar128 * 1.0 + fVar135 * 0.0;
                    fVar107 = fVar110 * 0.0 + fVar128 * 0.0 + fVar135 * 1.0;
                    fVar109 = fVar110 * 0.0 + fVar128 * 0.0 + fVar135 * 0.0;
                    fVar125 = fVar94 * 1.0 + fVar79 * 0.0 + fVar81 * 0.0;
                    fVar129 = fVar94 * 0.0 + fVar79 * 1.0 + fVar81 * 0.0;
                    fVar138 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 1.0;
                    fVar96 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 0.0;
                    local_188 = auVar8._4_4_;
                    fStack_184 = auVar8._8_4_;
                    local_198 = auVar8._0_4_;
                    fVar130 = local_198 * fVar111 + fVar105 * 0.0 + fVar125 * 0.0;
                    fVar132 = local_198 * fVar113 + fVar106 * 0.0 + fVar129 * 0.0;
                    fVar133 = local_198 * fVar115 + fVar107 * 0.0 + fVar138 * 0.0;
                    fVar134 = local_198 * fVar116 + fVar109 * 0.0 + fVar96 * 0.0;
                    fVar128 = fVar80 * fVar111 + fVar127 * fVar105 + fVar125 * 0.0;
                    fVar135 = fVar80 * fVar113 + fVar127 * fVar106 + fVar129 * 0.0;
                    fVar95 = fVar80 * fVar115 + fVar127 * fVar107 + fVar138 * 0.0;
                    fVar98 = fVar80 * fVar116 + fVar127 * fVar109 + fVar96 * 0.0;
                    local_148 = fVar108 * fVar111 + fVar117 * fVar105 + fVar119 * fVar125;
                    fStack_144 = fVar108 * fVar113 + fVar117 * fVar106 + fVar119 * fVar129;
                    fStack_140 = fVar108 * fVar115 + fVar117 * fVar107 + fVar119 * fVar138;
                    fStack_13c = fVar108 * fVar116 + fVar117 * fVar109 + fVar119 * fVar96;
                    fVar79 = pfVar1[0xf];
                    fVar81 = pfVar1[3];
                    fVar97 = pfVar1[7];
                    fVar123 = pfVar1[0xb];
                    fVar131 = fVar81 * fVar97 + fVar79 * fVar123;
                    fVar110 = fVar81 * fVar97 - fVar79 * fVar123;
                    fVar103 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                              -fVar123 * fVar123;
                    fVar127 = fVar79 * fVar79 - fVar81 * fVar81;
                    fVar137 = fVar97 * fVar97 + fVar127 + -fVar123 * fVar123;
                    fVar136 = fVar81 * fVar123 - fVar79 * fVar97;
                    fVar101 = fVar79 * fVar97 + fVar81 * fVar123;
                    fVar139 = fVar97 * fVar123 + fVar79 * fVar81;
                    fVar94 = fVar97 * fVar123 - fVar79 * fVar81;
                    fVar79 = *pfVar1;
                    fVar81 = pfVar1[4];
                    fVar80 = pfVar1[5];
                    fVar120 = fVar123 * fVar123 + fVar127 + -fVar97 * fVar97;
                    fVar97 = pfVar1[8];
                    fVar123 = pfVar1[9];
                    fVar127 = pfVar1[10];
                    fVar131 = fVar131 + fVar131;
                    fVar136 = fVar136 + fVar136;
                    fVar108 = pfVar1[0xc];
                    fVar117 = pfVar1[0xd];
                    fVar119 = pfVar1[0xe];
                    fVar99 = fVar103 * 1.0 + fVar131 * 0.0 + fVar136 * 0.0;
                    fVar100 = fVar103 * 0.0 + fVar131 * 1.0 + fVar136 * 0.0;
                    fVar136 = fVar103 * 0.0 + fVar131 * 0.0 + fVar136 * 1.0;
                    fVar110 = fVar110 + fVar110;
                    fVar139 = fVar139 + fVar139;
                    fVar101 = fVar101 + fVar101;
                    fVar94 = fVar94 + fVar94;
                    fVar103 = fVar110 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
                    fVar131 = fVar110 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
                    fVar110 = fVar110 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
                    fVar137 = fVar101 * 1.0 + fVar94 * 0.0 + fVar120 * 0.0;
                    fVar139 = fVar101 * 0.0 + fVar94 * 1.0 + fVar120 * 0.0;
                    fVar94 = fVar101 * 0.0 + fVar94 * 0.0 + fVar120 * 1.0;
                    fVar112 = fVar79 * fVar99 + fVar103 * 0.0 + fVar137 * 0.0;
                    fVar114 = fVar79 * fVar100 + fVar131 * 0.0 + fVar139 * 0.0;
                    fVar79 = fVar79 * fVar136 + fVar110 * 0.0 + fVar94 * 0.0;
                    fVar101 = fVar81 * fVar99 + fVar80 * fVar103 + fVar137 * 0.0;
                    fVar120 = fVar81 * fVar100 + fVar80 * fVar131 + fVar139 * 0.0;
                    fVar102 = fVar81 * fVar136 + fVar80 * fVar110 + fVar94 * 0.0;
                    fVar118 = fVar97 * fVar99 + fVar123 * fVar103 + fVar127 * fVar137;
                    fVar121 = fVar97 * fVar100 + fVar123 * fVar131 + fVar127 * fVar139;
                    fVar122 = fVar97 * fVar136 + fVar123 * fVar110 + fVar127 * fVar94;
                    fVar97 = fVar108 * fVar99 + fVar117 * fVar103 + fVar119 * fVar137 +
                             pfVar1[1] + 0.0;
                    fVar123 = fVar108 * fVar100 + fVar117 * fVar131 + fVar119 * fVar139 +
                              pfVar1[2] + 0.0;
                    fVar131 = fVar108 * fVar136 + fVar117 * fVar110 + fVar119 * fVar94 +
                              pfVar1[6] + 0.0;
                    fVar110 = fVar112 * fVar130 + fVar114 * fVar128 + fVar79 * local_148;
                    local_198 = fVar112 * fVar132 + fVar114 * fVar135 + fVar79 * fStack_144;
                    fVar81 = fVar112 * fVar133 + fVar114 * fVar95 + fVar79 * fStack_140;
                    fVar80 = fVar118 * fVar130 + fVar121 * fVar128 + fVar122 * local_148;
                    fVar127 = fVar118 * fVar132 + fVar121 * fVar135 + fVar122 * fStack_144;
                    fVar103 = fVar118 * fVar133 + fVar121 * fVar95 + fVar122 * fStack_140;
                    uVar71 = extraout_RDX_09;
                    fVar108 = fVar118 * fVar134 + fVar121 * fVar98 + fVar122 * fStack_13c;
                    fVar79 = fVar112 * fVar134 + fVar114 * fVar98 + fVar79 * fStack_13c;
                    fVar117 = fVar97 * fVar130 + fVar123 * fVar128 + fVar131 * local_148 +
                              fVar104 * fVar111 + fVar124 * fVar105 + fVar126 * fVar125 +
                              local_188 + 0.0;
                    fVar119 = fVar97 * fVar132 + fVar123 * fVar135 + fVar131 * fStack_144 +
                              fVar104 * fVar113 + fVar124 * fVar106 + fVar126 * fVar129 +
                              fStack_184 + 0.0;
                    fVar94 = fVar97 * fVar133 + fVar123 * fVar95 + fVar131 * fStack_140 +
                             fVar104 * fVar115 + fVar124 * fVar107 + fVar126 * fVar138 +
                             pfVar2[2] + 0.0;
                    fVar104 = fVar97 * fVar134 + fVar123 * fVar98 + fVar131 * fStack_13c +
                              fVar104 * fVar116 + fVar124 * fVar109 + fVar126 * fVar96 + 0.0;
                    fVar97 = fVar101 * fVar130 + fVar120 * fVar128 + fVar102 * local_148;
                    fVar124 = fVar101 * fVar132 + fVar120 * fVar135 + fVar102 * fStack_144;
                    fVar126 = fVar101 * fVar133 + fVar120 * fVar95 + fVar102 * fStack_140;
                    fVar123 = fVar101 * fVar134 + fVar120 * fVar98 + fVar102 * fStack_13c;
                  }
                }
                else {
                  pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x24);
                  auVar31._4_4_ = -(uint)(pfVar2[1] != 0.0);
                  auVar31._0_4_ = -(uint)(*pfVar2 != 0.0);
                  auVar31._8_4_ = -(uint)(pfVar2[2] != 1.0);
                  auVar31._12_4_ = -(uint)(pfVar2[3] != 0.0);
                  uVar75 = movmskps(uVar75,auVar31);
                  if ((((bVar9 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                     (((uVar75 & 4) != 0 ||
                      (bVar70 = ((byte)uVar75 & 8) >> 3,
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 != 0))))
                  goto LAB_00160368;
                  pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x14);
                  auVar32._4_4_ = -(uint)(pfVar2[1] != 0.0);
                  auVar32._0_4_ = -(uint)(*pfVar2 != 0.0);
                  auVar32._8_4_ = -(uint)(pfVar2[2] != 0.0);
                  auVar32._12_4_ = -(uint)(pfVar2[3] != 1.0);
                  uVar75 = movmskps(uVar75,auVar32);
                  if (((((bVar9 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0)
                      ) || (bVar70 = ((byte)uVar75 & 8) >> 3,
                           uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 != 0))
                  goto LAB_00160368;
                  pfVar2 = (float *)((long)pAVar13 + lVar74 + -4);
                  auVar33._4_4_ = -(uint)(pfVar2[1] != 0.0);
                  auVar33._0_4_ = -(uint)(*pfVar2 != 0.0);
                  auVar33._8_4_ = -(uint)(pfVar2[2] != 0.0);
                  auVar33._12_4_ = -(uint)(pfVar2[3] != 0.0);
                  uVar75 = movmskps(uVar75,auVar33);
                  if ((((bVar9 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0))
                  goto LAB_00160368;
                  bVar70 = ((byte)uVar75 & 8) >> 3;
                  uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
                  uVar71 = (ulong)uVar75;
                  if ((bVar70 != 0) ||
                     ((bVar9 != false &&
                      ((fVar79 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar74 + 0xc),
                       fVar79 != 1.0 || (NAN(fVar79))))))) goto LAB_00160368;
                  fVar110 = *pfVar1;
                  local_198 = pfVar1[1];
                  fVar81 = pfVar1[2];
                  fVar79 = pfVar1[3];
                  fVar97 = pfVar1[4];
                  fVar124 = pfVar1[5];
                  fVar126 = pfVar1[6];
                  fVar123 = pfVar1[7];
                  fVar80 = pfVar1[8];
                  fVar127 = pfVar1[9];
                  fVar103 = pfVar1[10];
                  fVar108 = pfVar1[0xb];
                  fVar117 = pfVar1[0xc];
                  fVar119 = pfVar1[0xd];
                  fVar94 = pfVar1[0xe];
                  fVar104 = pfVar1[0xf];
                  local_150 = (bool)bVar56;
                }
LAB_00160e3c:
                pfVar1 = (float *)((long)local_158 + lVar74 + -0x30);
                *pfVar1 = fVar110;
                pfVar1[1] = local_198;
                pfVar1[2] = fVar81;
                pfVar1[3] = fVar79;
                pfVar1 = (float *)((long)local_158 + lVar74 + -0x20);
                *pfVar1 = fVar97;
                pfVar1[1] = fVar124;
                pfVar1[2] = fVar126;
                pfVar1[3] = fVar123;
                pfVar1 = (float *)((long)local_158 + lVar74 + -0x10);
                *pfVar1 = fVar80;
                pfVar1[1] = fVar127;
                pfVar1[2] = fVar103;
                pfVar1[3] = fVar108;
                pfVar1 = (float *)((long)&(local_158->l).vx.field_0 + lVar74);
                *pfVar1 = fVar117;
                pfVar1[1] = fVar119;
                pfVar1[2] = fVar94;
                pfVar1[3] = fVar104;
                uVar72 = uVar72 + 1;
                lVar74 = lVar74 + 0x40;
                pAVar60 = local_158;
              } while (uVar72 < (spaces->spaces).size_active);
            }
          }
        }
        else {
          if (sVar11 != puVar73[2]) {
            prVar68 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar68,"number of transformations does not match");
            __cxa_throw(prVar68,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          fVar79 = (spaces->time_range).lower;
          fVar81 = (spaces->time_range).upper;
          fVar97 = (float)*puVar73;
          fVar123 = (float)((ulong)*puVar73 >> 0x20);
          uVar75 = -(uint)(fVar79 < fVar97);
          uVar77 = -(uint)(fVar81 < fVar123);
          local_178._0_8_ =
               CONCAT44(~uVar77 & (uint)fVar123,~uVar75 & (uint)fVar79) |
               CONCAT44((uint)fVar81 & uVar77,(uint)fVar97 & uVar75);
          local_178._16_8_ = 0;
          sStack_160 = 0;
          local_158 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
          if (sVar11 == 0) goto LAB_00161b60;
          local_158 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                      alignedMalloc(sVar11 << 6,0x10);
          pAVar60 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                    (spaces->spaces).size_active;
          local_150 = true;
          if (spaces->quaternion == false) {
            local_150 = SUB41(*(undefined4 *)(puVar73 + 5),0);
          }
          local_178._16_8_ = sVar11;
          sStack_160 = sVar11;
          if (pAVar60 != (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0) {
            lVar74 = 0x30;
            uVar72 = 0;
            uVar71 = extraout_RDX_12;
            do {
              uVar75 = (uint)uVar71;
              pAVar13 = (spaces->spaces).items;
              lVar12 = puVar73[4];
              bVar9 = spaces->quaternion;
              bVar56 = *(byte *)(puVar73 + 5);
              local_150 = false;
              fVar79 = *(float *)((long)pAVar13 + lVar74 + -0x30);
              uVar6 = *(undefined8 *)((long)pAVar13 + lVar74 + -0x2c);
              fVar81 = (float)((ulong)uVar6 >> 0x20);
              local_198 = (float)uVar6;
              if (((((fVar79 != 1.0) || (NAN(fVar79))) || (local_198 != 0.0)) ||
                  ((NAN(local_198) || (fVar81 != 0.0)))) || (NAN(fVar81))) {
LAB_0016103d:
                uVar6 = *(undefined8 *)(lVar12 + -0x30 + lVar74);
                fVar97 = (float)uVar6;
                fVar123 = (float)((ulong)uVar6 >> 0x20);
                iVar76 = -(uint)(fVar97 != 1.0);
                iVar78 = -(uint)(fVar123 != 0.0);
                auVar89._4_4_ = iVar78;
                auVar89._0_4_ = iVar76;
                auVar89._8_4_ = iVar78;
                auVar89._12_4_ = iVar78;
                auVar88._8_8_ = auVar89._8_8_;
                auVar88._4_4_ = iVar76;
                auVar88._0_4_ = iVar76;
                uVar75 = movmskpd(uVar75,auVar88);
                uVar71 = (ulong)uVar75;
                fVar79 = *(float *)(lVar12 + -0x28 + lVar74);
                if ((uVar75 & 1) == 0) {
                  bVar70 = (byte)uVar75 >> 1;
                  uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
                  uVar71 = (ulong)uVar75;
                  if (((bVar70 == 0) && (fVar79 == 0.0)) && (!NAN(fVar79))) {
                    pfVar1 = (float *)(lVar12 + -0x24 + lVar74);
                    auVar53._4_4_ = -(uint)(pfVar1[1] != 0.0);
                    auVar53._0_4_ = -(uint)(*pfVar1 != 0.0);
                    auVar53._8_4_ = -(uint)(pfVar1[2] != 1.0);
                    auVar53._12_4_ = -(uint)(pfVar1[3] != 0.0);
                    uVar75 = movmskps(uVar75,auVar53);
                    uVar71 = (ulong)uVar75;
                    if ((((bVar56 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                       ((uVar75 & 4) == 0)) {
                      bVar70 = ((byte)uVar75 & 8) >> 3;
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
                      uVar71 = (ulong)uVar75;
                      if (bVar70 == 0) {
                        pfVar1 = (float *)(lVar12 + -0x14 + lVar74);
                        auVar54._4_4_ = -(uint)(pfVar1[1] != 0.0);
                        auVar54._0_4_ = -(uint)(*pfVar1 != 0.0);
                        auVar54._8_4_ = -(uint)(pfVar1[2] != 0.0);
                        auVar54._12_4_ = -(uint)(pfVar1[3] != 1.0);
                        uVar75 = movmskps(uVar75,auVar54);
                        uVar71 = (ulong)uVar75;
                        if ((((bVar56 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                           ((uVar75 & 4) == 0)) {
                          bVar70 = ((byte)uVar75 & 8) >> 3;
                          uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
                          uVar71 = (ulong)uVar75;
                          if (bVar70 == 0) {
                            pfVar1 = (float *)(lVar12 + -4 + lVar74);
                            auVar55._4_4_ = -(uint)(pfVar1[1] != 0.0);
                            auVar55._0_4_ = -(uint)(*pfVar1 != 0.0);
                            auVar55._8_4_ = -(uint)(pfVar1[2] != 0.0);
                            auVar55._12_4_ = -(uint)(pfVar1[3] != 0.0);
                            uVar75 = movmskps(uVar75,auVar55);
                            uVar71 = (ulong)uVar75;
                            if ((((((bVar56 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                                 ((uVar75 & 4) == 0)) &&
                                (bVar70 = ((byte)uVar75 & 8) >> 3,
                                uVar71 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 == 0))
                               && ((bVar56 == 0 ||
                                   ((fVar80 = *(float *)(lVar12 + 0xc + lVar74), fVar80 == 1.0 &&
                                    (!NAN(fVar80))))))) {
                              pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x30);
                              fVar110 = *pfVar1;
                              local_198 = pfVar1[1];
                              fVar81 = pfVar1[2];
                              fVar79 = pfVar1[3];
                              pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x20);
                              fVar97 = *pfVar1;
                              fVar124 = pfVar1[1];
                              fVar126 = pfVar1[2];
                              fVar123 = pfVar1[3];
                              pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x10);
                              fVar80 = *pfVar1;
                              fVar127 = pfVar1[1];
                              fVar103 = pfVar1[2];
                              fVar108 = pfVar1[3];
                              pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                              fVar117 = *pfVar1;
                              fVar119 = pfVar1[1];
                              fVar94 = pfVar1[2];
                              fVar104 = pfVar1[3];
                              local_150 = bVar9;
                              goto LAB_00161b34;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                if ((bVar9 == false) && (bVar56 == 0)) {
                  pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x30);
                  fVar135 = *pfVar1;
                  fVar138 = pfVar1[1];
                  fVar95 = pfVar1[2];
                  fVar96 = pfVar1[3];
                  pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x20);
                  fVar98 = *pfVar1;
                  fVar131 = pfVar1[1];
                  fVar99 = pfVar1[2];
                  fVar100 = pfVar1[3];
                  pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x10);
                  fVar136 = *pfVar1;
                  fVar101 = pfVar1[1];
                  fVar137 = pfVar1[2];
                  fVar139 = pfVar1[3];
                  fVar110 = fVar97 * fVar135 + fVar123 * fVar98 + fVar79 * fVar136;
                  local_198 = fVar97 * fVar138 + fVar123 * fVar131 + fVar79 * fVar101;
                  fVar81 = fVar97 * fVar95 + fVar123 * fVar99 + fVar79 * fVar137;
                  fVar125 = *(float *)(lVar12 + -0x20 + lVar74);
                  fVar128 = *(float *)(lVar12 + -0x1c + lVar74);
                  fVar129 = *(float *)(lVar12 + -0x18 + lVar74);
                  fVar108 = *(float *)(lVar12 + -0x10 + lVar74);
                  fVar117 = *(float *)(lVar12 + -0xc + lVar74);
                  fVar119 = *(float *)(lVar12 + -8 + lVar74);
                  fVar80 = fVar108 * fVar135 + fVar117 * fVar98 + fVar119 * fVar136;
                  fVar127 = fVar108 * fVar138 + fVar117 * fVar131 + fVar119 * fVar101;
                  fVar103 = fVar108 * fVar95 + fVar117 * fVar99 + fVar119 * fVar137;
                  fVar104 = *(float *)(lVar12 + lVar74);
                  fVar124 = *(float *)(lVar12 + 4 + lVar74);
                  fVar126 = *(float *)(lVar12 + 8 + lVar74);
                  pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                  fVar108 = fVar108 * fVar96 + fVar117 * fVar100 + fVar119 * fVar139;
                  fVar79 = fVar97 * fVar96 + fVar123 * fVar100 + fVar79 * fVar139;
                  fVar117 = fVar104 * fVar135 + fVar124 * fVar98 + fVar126 * fVar136 + *pfVar1;
                  fVar119 = fVar104 * fVar138 + fVar124 * fVar131 + fVar126 * fVar101 + pfVar1[1];
                  fVar94 = fVar104 * fVar95 + fVar124 * fVar99 + fVar126 * fVar137 + pfVar1[2];
                  fVar104 = fVar104 * fVar96 + fVar124 * fVar100 + fVar126 * fVar139 + pfVar1[3];
                  fVar97 = fVar125 * fVar135 + fVar128 * fVar98 + fVar129 * fVar136;
                  fVar124 = fVar125 * fVar138 + fVar128 * fVar131 + fVar129 * fVar101;
                  fVar126 = fVar125 * fVar95 + fVar128 * fVar99 + fVar129 * fVar137;
                  fVar123 = fVar125 * fVar96 + fVar128 * fVar100 + fVar129 * fVar139;
                }
                else if ((bVar9 == false) || (bVar56 == 0)) {
                  if ((bVar9 == false) || (bVar56 != 0)) {
                    if (((local_198 != 0.0) ||
                        (((NAN(local_198) || (fVar81 != 0.0)) || (NAN(fVar81))))) ||
                       (uVar6 = *(undefined8 *)((long)pAVar13 + lVar74 + -0x10),
                       auVar37._4_4_ = -(uint)(*(float *)((long)pAVar13 + lVar74 + -0x20) != 0.0),
                       auVar37._0_4_ = -(uint)(*(float *)((long)pAVar13 + lVar74 + -0x18) != 0.0),
                       auVar37._8_4_ = -(uint)((float)uVar6 != 0.0),
                       auVar37._12_4_ = -(uint)((float)((ulong)uVar6 >> 0x20) != 0.0),
                       uVar57 = movmskps((int)CONCAT71((int7)((ulong)pAVar60 >> 8),bVar56),auVar37),
                       (char)uVar57 != '\0')) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                 ,0x83);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                      std::ostream::put(-0x30);
                      std::ostream::flush();
                      uVar71 = extraout_RDX_15;
                    }
                    pfVar2 = (float *)(lVar12 + -0x30 + lVar74);
                    fVar79 = pfVar2[3];
                    pfVar3 = (float *)(lVar12 + -0x20 + lVar74);
                    fVar97 = *pfVar3;
                    fVar123 = pfVar3[3];
                    pfVar5 = (float *)(lVar12 + -0x10 + lVar74);
                    fVar80 = *pfVar5;
                    fVar127 = pfVar5[1];
                    fVar108 = pfVar5[3];
                    pfVar1 = (float *)(lVar12 + lVar74);
                    fVar117 = *pfVar1;
                    fVar119 = pfVar1[1];
                    fVar94 = pfVar1[2];
                    fVar104 = pfVar1[3];
                    uVar6 = *(undefined8 *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                    fVar110 = *(float *)((long)pAVar13 + lVar74 + -0x30) * *pfVar2;
                    local_198 = pfVar2[1] + (float)uVar6;
                    fVar81 = pfVar2[2] + (float)((ulong)uVar6 >> 0x20);
                    fVar126 = pfVar3[2] + *(float *)((long)&(pAVar13->l).vx.field_0 + lVar74 + 8);
                    fVar124 = pfVar3[1] * *(float *)((long)pAVar13 + lVar74 + -0x1c);
                    fVar103 = pfVar5[2] * *(float *)((long)pAVar13 + lVar74 + -8);
                    local_150 = true;
                  }
                  else {
                    local_e8 = ZEXT416(*(uint *)((long)&(pAVar13->l).vx.field_0 + lVar74 + 0xc));
                    local_c8 = ZEXT416(*(uint *)((long)pAVar13 + lVar74 + -0x24));
                    local_b8 = ZEXT416(*(uint *)((long)pAVar13 + lVar74 + -0x14));
                    local_f8 = ZEXT416(*(uint *)((long)pAVar13 + lVar74 + -4));
                    pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x20);
                    local_118 = *pfVar1;
                    fStack_114 = pfVar1[1];
                    fStack_d0 = pfVar1[2];
                    fStack_10c = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x10);
                    local_108 = *pfVar1;
                    fStack_104 = pfVar1[1];
                    fStack_100 = pfVar1[2];
                    fStack_fc = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x30);
                    local_98 = *pfVar1;
                    fStack_8c = pfVar1[1];
                    pfVar1 = (float *)(lVar12 + -0x30 + lVar74);
                    fVar79 = *pfVar1;
                    fVar97 = pfVar1[1];
                    fVar123 = pfVar1[2];
                    pfVar1 = (float *)(lVar12 + -0x20 + lVar74);
                    fVar80 = *pfVar1;
                    fVar127 = pfVar1[1];
                    fVar108 = pfVar1[2];
                    puVar4 = (undefined8 *)(lVar12 + -0x10 + lVar74);
                    local_128 = *puVar4;
                    uStack_120 = puVar4[1];
                    pfVar1 = (float *)(lVar12 + lVar74);
                    fVar117 = *pfVar1;
                    fVar119 = pfVar1[1];
                    fVar94 = pfVar1[2];
                    fVar110 = fVar79 * local_98 + fVar97 * local_118 + fVar123 * local_108;
                    fVar104 = fVar79 * 0.0 + fVar97 * fStack_114 + fVar123 * fStack_104;
                    fVar79 = fVar79 * 0.0 + fVar97 * 0.0 + fVar123 * fStack_100;
                    local_148 = fVar80 * local_98 + fVar127 * local_118 + fVar108 * local_108;
                    fStack_144 = fVar80 * 0.0 + fVar127 * fStack_114 + fVar108 * fStack_104;
                    fStack_140 = fVar80 * 0.0 + fVar127 * 0.0 + fVar108 * fStack_100;
                    fStack_13c = fVar80 * fStack_8c + fVar127 * fStack_10c + fVar108 * fStack_fc;
                    fStack_110 = 0.0;
                    fStack_94 = 0.0;
                    fStack_90 = 0.0;
                    pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                    local_a8._0_4_ =
                         fVar117 * local_98 + fVar119 * local_118 + fVar94 * local_108 + *pfVar1;
                    local_a8._4_4_ =
                         fVar117 * 0.0 + fVar119 * fStack_114 + fVar94 * fStack_104 + pfVar1[1];
                    fStack_a0 = fVar117 * 0.0 + fVar119 * 0.0 + fVar94 * fStack_100 + pfVar1[2];
                    register0x0000128c =
                         fVar117 * fStack_8c + fVar119 * fStack_10c + fVar94 * fStack_fc + pfVar1[3]
                    ;
                    local_d8 = local_118;
                    fStack_d4 = fStack_114;
                    fStack_cc = fStack_10c;
                    if ((((fVar104 != 0.0) || (NAN(fVar104))) ||
                        ((fVar79 != 0.0 || ((NAN(fVar79) || (fStack_140 != 0.0)))))) ||
                       (NAN(fStack_140))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                 ,0x61);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                      std::ostream::put(-0x30);
                      std::ostream::flush();
                      uVar71 = extraout_RDX_14;
                    }
                    fVar80 = local_98 * (float)local_128 +
                             local_118 * local_128._4_4_ + local_108 * (float)uStack_120;
                    fVar127 = fStack_94 * (float)local_128 +
                              fStack_114 * local_128._4_4_ + fStack_104 * (float)uStack_120;
                    fVar103 = fStack_90 * (float)local_128 +
                              fStack_110 * local_128._4_4_ + fStack_100 * (float)uStack_120;
                    local_150 = true;
                    fVar108 = (float)local_f8._0_4_;
                    fVar79 = (float)local_c8._0_4_;
                    fVar117 = (float)local_a8._0_4_;
                    fVar119 = (float)local_a8._4_4_;
                    fVar94 = fStack_a0;
                    fVar104 = (float)local_e8._0_4_;
                    fVar97 = local_148;
                    fVar124 = fStack_144;
                    fVar126 = fStack_d0;
                    fVar123 = (float)local_b8._0_4_;
                  }
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                             ,0x67);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                  std::ostream::put(-0x30);
                  std::ostream::flush();
                  fVar79 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar74 + 0xc);
                  fVar81 = *(float *)((long)pAVar13 + lVar74 + -0x24);
                  fVar97 = *(float *)((long)pAVar13 + lVar74 + -0x14);
                  fVar123 = *(float *)((long)pAVar13 + lVar74 + -4);
                  auVar8 = *(undefined1 (*) [16])((long)pAVar13 + lVar74 + -0x30);
                  pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x20);
                  fVar80 = *pfVar2;
                  fVar127 = pfVar2[1];
                  pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x10);
                  fVar108 = *pfVar1;
                  fVar117 = pfVar1[1];
                  fVar119 = pfVar1[2];
                  fVar129 = fVar81 * fVar97 + fVar79 * fVar123;
                  fVar110 = fVar81 * fVar97 - fVar79 * fVar123;
                  fVar103 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                            -fVar123 * fVar123;
                  fVar125 = fVar79 * fVar79 - fVar81 * fVar81;
                  fVar128 = fVar97 * fVar97 + fVar125 + -fVar123 * fVar123;
                  fVar138 = fVar81 * fVar123 - fVar79 * fVar97;
                  fVar94 = fVar79 * fVar97 + fVar81 * fVar123;
                  fVar135 = fVar97 * fVar123 + fVar79 * fVar81;
                  fVar79 = fVar97 * fVar123 - fVar79 * fVar81;
                  pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                  fVar104 = *pfVar1;
                  fVar124 = pfVar1[1];
                  fVar126 = pfVar1[2];
                  fVar129 = fVar129 + fVar129;
                  fVar138 = fVar138 + fVar138;
                  fVar110 = fVar110 + fVar110;
                  fVar135 = fVar135 + fVar135;
                  fVar94 = fVar94 + fVar94;
                  fVar79 = fVar79 + fVar79;
                  fVar81 = fVar123 * fVar123 + fVar125 + -fVar97 * fVar97;
                  fVar111 = fVar103 * 1.0 + fVar129 * 0.0 + fVar138 * 0.0;
                  fVar113 = fVar103 * 0.0 + fVar129 * 1.0 + fVar138 * 0.0;
                  fVar115 = fVar103 * 0.0 + fVar129 * 0.0 + fVar138 * 1.0;
                  fVar116 = fVar103 * 0.0 + fVar129 * 0.0 + fVar138 * 0.0;
                  fVar105 = fVar110 * 1.0 + fVar128 * 0.0 + fVar135 * 0.0;
                  fVar106 = fVar110 * 0.0 + fVar128 * 1.0 + fVar135 * 0.0;
                  fVar107 = fVar110 * 0.0 + fVar128 * 0.0 + fVar135 * 1.0;
                  fVar109 = fVar110 * 0.0 + fVar128 * 0.0 + fVar135 * 0.0;
                  fVar125 = fVar94 * 1.0 + fVar79 * 0.0 + fVar81 * 0.0;
                  fVar129 = fVar94 * 0.0 + fVar79 * 1.0 + fVar81 * 0.0;
                  fVar138 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 1.0;
                  fVar96 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 0.0;
                  local_188 = auVar8._4_4_;
                  fStack_184 = auVar8._8_4_;
                  local_198 = auVar8._0_4_;
                  fVar130 = local_198 * fVar111 + fVar105 * 0.0 + fVar125 * 0.0;
                  fVar132 = local_198 * fVar113 + fVar106 * 0.0 + fVar129 * 0.0;
                  fVar133 = local_198 * fVar115 + fVar107 * 0.0 + fVar138 * 0.0;
                  fVar134 = local_198 * fVar116 + fVar109 * 0.0 + fVar96 * 0.0;
                  fVar128 = fVar80 * fVar111 + fVar127 * fVar105 + fVar125 * 0.0;
                  fVar135 = fVar80 * fVar113 + fVar127 * fVar106 + fVar129 * 0.0;
                  fVar95 = fVar80 * fVar115 + fVar127 * fVar107 + fVar138 * 0.0;
                  fVar98 = fVar80 * fVar116 + fVar127 * fVar109 + fVar96 * 0.0;
                  local_148 = fVar108 * fVar111 + fVar117 * fVar105 + fVar119 * fVar125;
                  fStack_144 = fVar108 * fVar113 + fVar117 * fVar106 + fVar119 * fVar129;
                  fStack_140 = fVar108 * fVar115 + fVar117 * fVar107 + fVar119 * fVar138;
                  fStack_13c = fVar108 * fVar116 + fVar117 * fVar109 + fVar119 * fVar96;
                  fVar79 = *(float *)(lVar12 + 0xc + lVar74);
                  fVar81 = *(float *)(lVar12 + -0x24 + lVar74);
                  fVar97 = *(float *)(lVar12 + -0x14 + lVar74);
                  fVar123 = *(float *)(lVar12 + -4 + lVar74);
                  fVar131 = fVar81 * fVar97 + fVar79 * fVar123;
                  fVar110 = fVar81 * fVar97 - fVar79 * fVar123;
                  fVar103 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                            -fVar123 * fVar123;
                  fVar127 = fVar79 * fVar79 - fVar81 * fVar81;
                  fVar137 = fVar97 * fVar97 + fVar127 + -fVar123 * fVar123;
                  fVar136 = fVar81 * fVar123 - fVar79 * fVar97;
                  fVar101 = fVar79 * fVar97 + fVar81 * fVar123;
                  fVar139 = fVar97 * fVar123 + fVar79 * fVar81;
                  fVar94 = fVar97 * fVar123 - fVar79 * fVar81;
                  pfVar3 = (float *)(lVar12 + -0x30 + lVar74);
                  fVar79 = *pfVar3;
                  pfVar5 = (float *)(lVar12 + -0x20 + lVar74);
                  fVar81 = *pfVar5;
                  fVar80 = pfVar5[1];
                  fVar120 = fVar123 * fVar123 + fVar127 + -fVar97 * fVar97;
                  pfVar1 = (float *)(lVar12 + -0x10 + lVar74);
                  fVar97 = *pfVar1;
                  fVar123 = pfVar1[1];
                  fVar127 = pfVar1[2];
                  fVar131 = fVar131 + fVar131;
                  fVar136 = fVar136 + fVar136;
                  pfVar1 = (float *)(lVar12 + lVar74);
                  fVar108 = *pfVar1;
                  fVar117 = pfVar1[1];
                  fVar119 = pfVar1[2];
                  fVar99 = fVar103 * 1.0 + fVar131 * 0.0 + fVar136 * 0.0;
                  fVar100 = fVar103 * 0.0 + fVar131 * 1.0 + fVar136 * 0.0;
                  fVar136 = fVar103 * 0.0 + fVar131 * 0.0 + fVar136 * 1.0;
                  fVar110 = fVar110 + fVar110;
                  fVar139 = fVar139 + fVar139;
                  fVar101 = fVar101 + fVar101;
                  fVar94 = fVar94 + fVar94;
                  fVar103 = fVar110 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
                  fVar131 = fVar110 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
                  fVar110 = fVar110 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
                  fVar137 = fVar101 * 1.0 + fVar94 * 0.0 + fVar120 * 0.0;
                  fVar139 = fVar101 * 0.0 + fVar94 * 1.0 + fVar120 * 0.0;
                  fVar94 = fVar101 * 0.0 + fVar94 * 0.0 + fVar120 * 1.0;
                  fVar112 = fVar79 * fVar99 + fVar103 * 0.0 + fVar137 * 0.0;
                  fVar114 = fVar79 * fVar100 + fVar131 * 0.0 + fVar139 * 0.0;
                  fVar79 = fVar79 * fVar136 + fVar110 * 0.0 + fVar94 * 0.0;
                  fVar101 = fVar81 * fVar99 + fVar80 * fVar103 + fVar137 * 0.0;
                  fVar120 = fVar81 * fVar100 + fVar80 * fVar131 + fVar139 * 0.0;
                  fVar102 = fVar81 * fVar136 + fVar80 * fVar110 + fVar94 * 0.0;
                  fVar118 = fVar97 * fVar99 + fVar123 * fVar103 + fVar127 * fVar137;
                  fVar121 = fVar97 * fVar100 + fVar123 * fVar131 + fVar127 * fVar139;
                  fVar122 = fVar97 * fVar136 + fVar123 * fVar110 + fVar127 * fVar94;
                  fVar97 = fVar108 * fVar99 + fVar117 * fVar103 + fVar119 * fVar137 +
                           pfVar3[1] + 0.0;
                  fVar123 = fVar108 * fVar100 + fVar117 * fVar131 + fVar119 * fVar139 +
                            pfVar3[2] + 0.0;
                  fVar131 = fVar108 * fVar136 + fVar117 * fVar110 + fVar119 * fVar94 +
                            pfVar5[2] + 0.0;
                  fVar110 = fVar112 * fVar130 + fVar114 * fVar128 + fVar79 * local_148;
                  local_198 = fVar112 * fVar132 + fVar114 * fVar135 + fVar79 * fStack_144;
                  fVar81 = fVar112 * fVar133 + fVar114 * fVar95 + fVar79 * fStack_140;
                  fVar80 = fVar118 * fVar130 + fVar121 * fVar128 + fVar122 * local_148;
                  fVar127 = fVar118 * fVar132 + fVar121 * fVar135 + fVar122 * fStack_144;
                  fVar103 = fVar118 * fVar133 + fVar121 * fVar95 + fVar122 * fStack_140;
                  uVar71 = extraout_RDX_13;
                  fVar108 = fVar118 * fVar134 + fVar121 * fVar98 + fVar122 * fStack_13c;
                  fVar79 = fVar112 * fVar134 + fVar114 * fVar98 + fVar79 * fStack_13c;
                  fVar117 = fVar97 * fVar130 + fVar123 * fVar128 + fVar131 * local_148 +
                            fVar104 * fVar111 + fVar124 * fVar105 + fVar126 * fVar125 +
                            local_188 + 0.0;
                  fVar119 = fVar97 * fVar132 + fVar123 * fVar135 + fVar131 * fStack_144 +
                            fVar104 * fVar113 + fVar124 * fVar106 + fVar126 * fVar129 +
                            fStack_184 + 0.0;
                  fVar94 = fVar97 * fVar133 + fVar123 * fVar95 + fVar131 * fStack_140 +
                           fVar104 * fVar115 + fVar124 * fVar107 + fVar126 * fVar138 +
                           pfVar2[2] + 0.0;
                  fVar104 = fVar97 * fVar134 + fVar123 * fVar98 + fVar131 * fStack_13c +
                            fVar104 * fVar116 + fVar124 * fVar109 + fVar126 * fVar96 + 0.0;
                  fVar97 = fVar101 * fVar130 + fVar120 * fVar128 + fVar102 * local_148;
                  fVar124 = fVar101 * fVar132 + fVar120 * fVar135 + fVar102 * fStack_144;
                  fVar126 = fVar101 * fVar133 + fVar120 * fVar95 + fVar102 * fStack_140;
                  fVar123 = fVar101 * fVar134 + fVar120 * fVar98 + fVar102 * fStack_13c;
                }
              }
              else {
                pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x24);
                auVar8._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar8._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar8._8_4_ = -(uint)(pfVar1[2] != 1.0);
                auVar8._12_4_ = -(uint)(pfVar1[3] != 0.0);
                uVar75 = movmskps(uVar75,auVar8);
                if ((((bVar9 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                   (((uVar75 & 4) != 0 ||
                    (bVar70 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70)
                    , bVar70 != 0)))) goto LAB_0016103d;
                pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x14);
                auVar35._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar35._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar35._8_4_ = -(uint)(pfVar1[2] != 0.0);
                auVar35._12_4_ = -(uint)(pfVar1[3] != 1.0);
                uVar75 = movmskps(uVar75,auVar35);
                if (((((bVar9 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0))
                   || (bVar70 = ((byte)uVar75 & 8) >> 3,
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 != 0))
                goto LAB_0016103d;
                pfVar1 = (float *)((long)pAVar13 + lVar74 + -4);
                auVar36._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar36._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar36._8_4_ = -(uint)(pfVar1[2] != 0.0);
                auVar36._12_4_ = -(uint)(pfVar1[3] != 0.0);
                uVar75 = movmskps(uVar75,auVar36);
                if ((((bVar9 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0))
                goto LAB_0016103d;
                bVar70 = ((byte)uVar75 & 8) >> 3;
                uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
                uVar71 = (ulong)uVar75;
                if ((bVar70 != 0) ||
                   ((bVar9 != false &&
                    ((fVar79 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar74 + 0xc),
                     fVar79 != 1.0 || (NAN(fVar79))))))) goto LAB_0016103d;
                pfVar1 = (float *)(lVar12 + -0x30 + lVar74);
                fVar110 = *pfVar1;
                local_198 = pfVar1[1];
                fVar81 = pfVar1[2];
                fVar79 = pfVar1[3];
                pfVar1 = (float *)(lVar12 + -0x20 + lVar74);
                fVar97 = *pfVar1;
                fVar124 = pfVar1[1];
                fVar126 = pfVar1[2];
                fVar123 = pfVar1[3];
                pfVar1 = (float *)(lVar12 + -0x10 + lVar74);
                fVar80 = *pfVar1;
                fVar127 = pfVar1[1];
                fVar103 = pfVar1[2];
                fVar108 = pfVar1[3];
                pfVar1 = (float *)(lVar12 + lVar74);
                fVar117 = *pfVar1;
                fVar119 = pfVar1[1];
                fVar94 = pfVar1[2];
                fVar104 = pfVar1[3];
                local_150 = (bool)bVar56;
              }
LAB_00161b34:
              pfVar1 = (float *)((long)local_158 + lVar74 + -0x30);
              *pfVar1 = fVar110;
              pfVar1[1] = local_198;
              pfVar1[2] = fVar81;
              pfVar1[3] = fVar79;
              pfVar1 = (float *)((long)local_158 + lVar74 + -0x20);
              *pfVar1 = fVar97;
              pfVar1[1] = fVar124;
              pfVar1[2] = fVar126;
              pfVar1[3] = fVar123;
              pfVar1 = (float *)((long)local_158 + lVar74 + -0x10);
              *pfVar1 = fVar80;
              pfVar1[1] = fVar127;
              pfVar1[2] = fVar103;
              pfVar1[3] = fVar108;
              pfVar1 = (float *)((long)&(local_158->l).vx.field_0 + lVar74);
              *pfVar1 = fVar117;
              pfVar1[1] = fVar119;
              pfVar1[2] = fVar94;
              pfVar1[3] = fVar104;
              uVar72 = uVar72 + 1;
              lVar74 = lVar74 + 0x40;
              pAVar60 = local_158;
            } while (uVar72 < (spaces->spaces).size_active);
          }
        }
        convertGeometries(local_80,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                    *)local_130,local_40,(Transformations *)local_178);
        alignedFree(local_158);
        uVar72 = local_38 + 1;
        lVar74 = local_48[0xd];
        uVar71 = 0xaaaaaaaaaaaaaaab;
        plVar58 = local_48;
      } while (uVar72 < (ulong)((local_48[0xe] - lVar74 >> 4) * -0x5555555555555555));
    }
    (**(code **)(*plVar58 + 0x18))(plVar58);
    return;
  }
  (**(code **)(*plVar58 + 0x10))(plVar58);
  sVar11 = (spaces->spaces).size_active;
  if (sVar11 == 1) {
    fVar79 = (spaces->time_range).lower;
    fVar81 = (spaces->time_range).upper;
    fVar97 = (float)plVar58[0xd];
    fVar123 = (float)((ulong)plVar58[0xd] >> 0x20);
    uVar75 = -(uint)(fVar79 < fVar97);
    uVar77 = -(uint)(fVar81 < fVar123);
    local_178._0_8_ =
         CONCAT44(~uVar77 & (uint)fVar123,~uVar75 & (uint)fVar79) |
         CONCAT44((uint)fVar81 & uVar77,(uint)fVar97 & uVar75);
    sVar11 = plVar58[0xf];
    local_178._16_8_ = 0;
    sStack_160 = 0;
    local_158 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
    if (sVar11 == 0) {
      local_150 = false;
    }
    else {
      local_158 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                  alignedMalloc(sVar11 << 6,0x10);
      local_150 = false;
      local_178._16_8_ = sVar11;
      sStack_160 = sVar11;
      if (plVar58[0xf] != 0) {
        lVar74 = 0x30;
        uVar72 = 0;
        uVar71 = extraout_RDX;
        do {
          uVar75 = (uint)uVar71;
          pAVar60 = (spaces->spaces).items;
          lVar12 = plVar58[0x11];
          bVar9 = spaces->quaternion;
          uVar69 = (undefined7)((ulong)local_158 >> 8);
          uVar59 = CONCAT71(uVar69,bVar9);
          bVar56 = *(byte *)(plVar58 + 0x12);
          local_150 = false;
          fVar79 = (pAVar60->l).vx.field_0.m128[0];
          uVar6 = *(undefined8 *)((long)&(pAVar60->l).vx.field_0 + 4);
          fVar81 = (float)((ulong)uVar6 >> 0x20);
          local_198 = (float)uVar6;
          if ((((fVar79 != 1.0) || (NAN(fVar79))) || (local_198 != 0.0)) ||
             (((NAN(local_198) || (fVar81 != 0.0)) || (NAN(fVar81))))) {
LAB_0015e967:
            uVar6 = *(undefined8 *)(lVar12 + -0x30 + lVar74);
            fVar97 = (float)uVar6;
            fVar123 = (float)((ulong)uVar6 >> 0x20);
            iVar76 = -(uint)(fVar97 != 1.0);
            iVar78 = -(uint)(fVar123 != 0.0);
            auVar83._4_4_ = iVar78;
            auVar83._0_4_ = iVar76;
            auVar83._8_4_ = iVar78;
            auVar83._12_4_ = iVar78;
            auVar82._8_8_ = auVar83._8_8_;
            auVar82._4_4_ = iVar76;
            auVar82._0_4_ = iVar76;
            uVar75 = movmskpd(uVar75,auVar82);
            fVar79 = *(float *)(lVar12 + -0x28 + lVar74);
            if (((uVar75 & 1) == 0) &&
               (((bVar70 = (byte)uVar75 >> 1, bVar70 == 0 && (fVar79 == 0.0)) && (!NAN(fVar79))))) {
              pfVar1 = (float *)(lVar12 + -0x24 + lVar74);
              auVar38._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar38._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar38._8_4_ = -(uint)(pfVar1[2] != 1.0);
              auVar38._12_4_ = -(uint)(pfVar1[3] != 0.0);
              uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar38);
              if ((((bVar56 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                 (((uVar75 & 4) == 0 && (bVar70 = ((byte)uVar75 & 8) >> 3, bVar70 == 0)))) {
                pfVar1 = (float *)(lVar12 + -0x14 + lVar74);
                auVar39._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar39._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar39._8_4_ = -(uint)(pfVar1[2] != 0.0);
                auVar39._12_4_ = -(uint)(pfVar1[3] != 1.0);
                uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar39);
                if ((((bVar56 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                   (((uVar75 & 4) == 0 && (bVar70 = ((byte)uVar75 & 8) >> 3, bVar70 == 0)))) {
                  pfVar1 = (float *)(lVar12 + -4 + lVar74);
                  auVar40._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar40._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar40._8_4_ = -(uint)(pfVar1[2] != 0.0);
                  auVar40._12_4_ = -(uint)(pfVar1[3] != 0.0);
                  uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar40);
                  if ((((((bVar56 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                       ((uVar75 & 4) == 0)) &&
                      (bVar70 = ((byte)uVar75 & 8) >> 3,
                      uVar71 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 == 0)) &&
                     ((bVar56 == 0 ||
                      ((fVar80 = *(float *)(lVar12 + 0xc + lVar74), fVar80 == 1.0 && (!NAN(fVar80)))
                      )))) {
                    fVar80 = (pAVar60->l).vx.field_0.m128[0];
                    local_198 = (pAVar60->l).vx.field_0.m128[1];
                    fVar81 = (pAVar60->l).vx.field_0.m128[2];
                    fVar123 = (pAVar60->l).vx.field_0.m128[3];
                    fVar127 = (pAVar60->l).vy.field_0.m128[0];
                    fVar108 = (pAVar60->l).vy.field_0.m128[1];
                    fVar117 = (pAVar60->l).vy.field_0.m128[2];
                    fVar119 = (pAVar60->l).vy.field_0.m128[3];
                    fVar79 = (pAVar60->l).vz.field_0.m128[0];
                    fVar97 = (pAVar60->l).vz.field_0.m128[1];
                    fVar94 = (pAVar60->l).vz.field_0.m128[2];
                    fVar104 = (pAVar60->l).vz.field_0.m128[3];
                    fVar110 = (pAVar60->p).field_0.m128[0];
                    fVar124 = (pAVar60->p).field_0.m128[1];
                    fVar126 = (pAVar60->p).field_0.m128[2];
                    fVar103 = (pAVar60->p).field_0.m128[3];
                    local_150 = bVar9;
                    goto LAB_0015f0b1;
                  }
                }
              }
            }
            uVar71 = uVar59 & 0xffffffff;
            bVar70 = (byte)uVar71 | bVar56;
            uVar71 = CONCAT71((int7)(uVar71 >> 8),bVar70);
            if (bVar70 == 0) {
              fVar126 = (pAVar60->l).vx.field_0.m128[0];
              fVar129 = (pAVar60->l).vx.field_0.m128[1];
              fVar135 = (pAVar60->l).vx.field_0.m128[2];
              fVar138 = (pAVar60->l).vx.field_0.m128[3];
              fVar95 = (pAVar60->l).vy.field_0.m128[0];
              fVar96 = (pAVar60->l).vy.field_0.m128[1];
              fVar98 = (pAVar60->l).vy.field_0.m128[2];
              fVar131 = (pAVar60->l).vy.field_0.m128[3];
              fVar99 = (pAVar60->l).vz.field_0.m128[0];
              fVar100 = (pAVar60->l).vz.field_0.m128[1];
              fVar136 = (pAVar60->l).vz.field_0.m128[2];
              fVar101 = (pAVar60->l).vz.field_0.m128[3];
              fVar80 = fVar97 * fVar126 + fVar123 * fVar95 + fVar79 * fVar99;
              local_198 = fVar97 * fVar129 + fVar123 * fVar96 + fVar79 * fVar100;
              fVar81 = fVar97 * fVar135 + fVar123 * fVar98 + fVar79 * fVar136;
              fVar123 = fVar97 * fVar138 + fVar123 * fVar131 + fVar79 * fVar101;
              fVar79 = *(float *)(lVar12 + -0x20 + lVar74);
              fVar97 = *(float *)(lVar12 + -0x1c + lVar74);
              fVar119 = *(float *)(lVar12 + -0x18 + lVar74);
              fVar104 = *(float *)(lVar12 + -0x10 + lVar74);
              fVar127 = fVar79 * fVar126 + fVar97 * fVar95 + fVar119 * fVar99;
              fVar108 = fVar79 * fVar129 + fVar97 * fVar96 + fVar119 * fVar100;
              fVar117 = fVar79 * fVar135 + fVar97 * fVar98 + fVar119 * fVar136;
              fVar119 = fVar79 * fVar138 + fVar97 * fVar131 + fVar119 * fVar101;
              fVar110 = *(float *)(lVar12 + -0xc + lVar74);
              fVar124 = *(float *)(lVar12 + -8 + lVar74);
              fVar79 = fVar104 * fVar126 + fVar110 * fVar95 + fVar124 * fVar99;
              fVar97 = fVar104 * fVar129 + fVar110 * fVar96 + fVar124 * fVar100;
              fVar94 = fVar104 * fVar135 + fVar110 * fVar98 + fVar124 * fVar136;
              fVar104 = fVar104 * fVar138 + fVar110 * fVar131 + fVar124 * fVar101;
              fVar103 = *(float *)(lVar12 + lVar74);
              fVar125 = *(float *)(lVar12 + 4 + lVar74);
              fVar128 = *(float *)(lVar12 + 8 + lVar74);
              fVar110 = fVar103 * fVar126 + fVar125 * fVar95 + fVar128 * fVar99 +
                        (pAVar60->p).field_0.m128[0];
              fVar124 = fVar103 * fVar129 + fVar125 * fVar96 + fVar128 * fVar100 +
                        (pAVar60->p).field_0.m128[1];
              fVar126 = fVar103 * fVar135 + fVar125 * fVar98 + fVar128 * fVar136 +
                        (pAVar60->p).field_0.m128[2];
              fVar103 = fVar103 * fVar138 + fVar125 * fVar131 + fVar128 * fVar101 +
                        (pAVar60->p).field_0.m128[3];
            }
            else {
              uVar59 = uVar59 & 0xffffffff;
              bVar70 = (byte)uVar59 & bVar56;
              uVar71 = CONCAT71((int7)(uVar59 >> 8),bVar70);
              if (bVar70 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                           ,0x67);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                std::ostream::put(-0x30);
                std::ostream::flush();
                fVar79 = (pAVar60->p).field_0.m128[3];
                fVar81 = (pAVar60->l).vx.field_0.m128[3];
                fVar97 = (pAVar60->l).vy.field_0.m128[3];
                fVar123 = (pAVar60->l).vz.field_0.m128[3];
                aVar7 = (pAVar60->l).vx.field_0.field_1;
                fVar80 = (pAVar60->l).vy.field_0.m128[0];
                fVar127 = (pAVar60->l).vy.field_0.m128[1];
                fVar108 = (pAVar60->l).vz.field_0.m128[0];
                fVar117 = (pAVar60->l).vz.field_0.m128[1];
                fVar119 = (pAVar60->l).vz.field_0.m128[2];
                fVar129 = fVar81 * fVar97 + fVar79 * fVar123;
                fVar104 = fVar81 * fVar97 - fVar79 * fVar123;
                fVar110 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 + -fVar123 * fVar123;
                fVar124 = fVar79 * fVar79 - fVar81 * fVar81;
                fVar126 = fVar97 * fVar97 + fVar124 + -fVar123 * fVar123;
                fVar138 = fVar81 * fVar123 - fVar79 * fVar97;
                fVar94 = fVar79 * fVar97 + fVar81 * fVar123;
                fVar135 = fVar97 * fVar123 + fVar79 * fVar81;
                fVar79 = fVar97 * fVar123 - fVar79 * fVar81;
                fVar103 = (pAVar60->p).field_0.m128[0];
                fVar125 = (pAVar60->p).field_0.m128[1];
                fVar128 = (pAVar60->p).field_0.m128[2];
                fVar129 = fVar129 + fVar129;
                fVar138 = fVar138 + fVar138;
                fVar104 = fVar104 + fVar104;
                fVar135 = fVar135 + fVar135;
                fVar94 = fVar94 + fVar94;
                fVar79 = fVar79 + fVar79;
                fVar81 = fVar123 * fVar123 + fVar124 + -fVar97 * fVar97;
                fVar111 = fVar110 * 1.0 + fVar129 * 0.0 + fVar138 * 0.0;
                fVar113 = fVar110 * 0.0 + fVar129 * 1.0 + fVar138 * 0.0;
                fVar115 = fVar110 * 0.0 + fVar129 * 0.0 + fVar138 * 1.0;
                fVar118 = fVar110 * 0.0 + fVar129 * 0.0 + fVar138 * 0.0;
                fVar105 = fVar104 * 1.0 + fVar126 * 0.0 + fVar135 * 0.0;
                fVar106 = fVar104 * 0.0 + fVar126 * 1.0 + fVar135 * 0.0;
                fVar107 = fVar104 * 0.0 + fVar126 * 0.0 + fVar135 * 1.0;
                fVar109 = fVar104 * 0.0 + fVar126 * 0.0 + fVar135 * 0.0;
                fVar110 = fVar94 * 1.0 + fVar79 * 0.0 + fVar81 * 0.0;
                fVar124 = fVar94 * 0.0 + fVar79 * 1.0 + fVar81 * 0.0;
                fVar126 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 1.0;
                fVar95 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 0.0;
                local_188 = aVar7.y;
                fStack_184 = aVar7.z;
                local_198 = aVar7.x;
                fVar130 = local_198 * fVar111 + fVar105 * 0.0 + fVar110 * 0.0;
                fVar132 = local_198 * fVar113 + fVar106 * 0.0 + fVar124 * 0.0;
                fVar133 = local_198 * fVar115 + fVar107 * 0.0 + fVar126 * 0.0;
                fVar134 = local_198 * fVar118 + fVar109 * 0.0 + fVar95 * 0.0;
                fVar129 = fVar80 * fVar111 + fVar127 * fVar105 + fVar110 * 0.0;
                fVar135 = fVar80 * fVar113 + fVar127 * fVar106 + fVar124 * 0.0;
                fVar138 = fVar80 * fVar115 + fVar127 * fVar107 + fVar126 * 0.0;
                fVar96 = fVar80 * fVar118 + fVar127 * fVar109 + fVar95 * 0.0;
                local_148 = fVar108 * fVar111 + fVar117 * fVar105 + fVar119 * fVar110;
                fStack_144 = fVar108 * fVar113 + fVar117 * fVar106 + fVar119 * fVar124;
                fStack_140 = fVar108 * fVar115 + fVar117 * fVar107 + fVar119 * fVar126;
                fStack_13c = fVar108 * fVar118 + fVar117 * fVar109 + fVar119 * fVar95;
                fVar79 = *(float *)(lVar12 + 0xc + lVar74);
                fVar81 = *(float *)(lVar12 + -0x24 + lVar74);
                fVar97 = *(float *)(lVar12 + -0x14 + lVar74);
                fVar123 = *(float *)(lVar12 + -4 + lVar74);
                fVar131 = fVar81 * fVar97 + fVar79 * fVar123;
                fVar104 = fVar81 * fVar97 - fVar79 * fVar123;
                fVar98 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 + -fVar123 * fVar123;
                fVar127 = fVar79 * fVar79 - fVar81 * fVar81;
                fVar137 = fVar97 * fVar97 + fVar127 + -fVar123 * fVar123;
                fVar136 = fVar81 * fVar123 - fVar79 * fVar97;
                fVar101 = fVar79 * fVar97 + fVar81 * fVar123;
                fVar139 = fVar97 * fVar123 + fVar79 * fVar81;
                fVar94 = fVar97 * fVar123 - fVar79 * fVar81;
                pfVar1 = (float *)(lVar12 + -0x30 + lVar74);
                fVar79 = *pfVar1;
                pfVar2 = (float *)(lVar12 + -0x20 + lVar74);
                fVar81 = *pfVar2;
                fVar80 = pfVar2[1];
                fVar120 = fVar123 * fVar123 + fVar127 + -fVar97 * fVar97;
                pfVar3 = (float *)(lVar12 + -0x10 + lVar74);
                fVar97 = *pfVar3;
                fVar123 = pfVar3[1];
                fVar127 = pfVar3[2];
                fVar131 = fVar131 + fVar131;
                fVar136 = fVar136 + fVar136;
                pfVar3 = (float *)(lVar12 + lVar74);
                fVar108 = *pfVar3;
                fVar117 = pfVar3[1];
                fVar119 = pfVar3[2];
                fVar99 = fVar98 * 1.0 + fVar131 * 0.0 + fVar136 * 0.0;
                fVar100 = fVar98 * 0.0 + fVar131 * 1.0 + fVar136 * 0.0;
                fVar136 = fVar98 * 0.0 + fVar131 * 0.0 + fVar136 * 1.0;
                fVar104 = fVar104 + fVar104;
                fVar139 = fVar139 + fVar139;
                fVar101 = fVar101 + fVar101;
                fVar94 = fVar94 + fVar94;
                fVar98 = fVar104 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
                fVar131 = fVar104 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
                fVar104 = fVar104 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
                fVar137 = fVar101 * 1.0 + fVar94 * 0.0 + fVar120 * 0.0;
                fVar139 = fVar101 * 0.0 + fVar94 * 1.0 + fVar120 * 0.0;
                fVar94 = fVar101 * 0.0 + fVar94 * 0.0 + fVar120 * 1.0;
                fVar112 = fVar79 * fVar99 + fVar98 * 0.0 + fVar137 * 0.0;
                fVar114 = fVar79 * fVar100 + fVar131 * 0.0 + fVar139 * 0.0;
                fVar116 = fVar79 * fVar136 + fVar104 * 0.0 + fVar94 * 0.0;
                fVar101 = fVar81 * fVar99 + fVar80 * fVar98 + fVar137 * 0.0;
                fVar120 = fVar81 * fVar100 + fVar80 * fVar131 + fVar139 * 0.0;
                fVar102 = fVar81 * fVar136 + fVar80 * fVar104 + fVar94 * 0.0;
                fVar121 = fVar97 * fVar99 + fVar123 * fVar98 + fVar127 * fVar137;
                fVar122 = fVar97 * fVar100 + fVar123 * fVar131 + fVar127 * fVar139;
                fVar123 = fVar97 * fVar136 + fVar123 * fVar104 + fVar127 * fVar94;
                fVar127 = fVar108 * fVar99 + fVar117 * fVar98 + fVar119 * fVar137 + pfVar1[1] + 0.0;
                fVar98 = fVar108 * fVar100 + fVar117 * fVar131 + fVar119 * fVar139 + pfVar1[2] + 0.0
                ;
                fVar108 = fVar108 * fVar136 + fVar117 * fVar104 + fVar119 * fVar94 + pfVar2[2] + 0.0
                ;
                fVar80 = fVar112 * fVar130 + fVar114 * fVar129 + fVar116 * local_148;
                local_198 = fVar112 * fVar132 + fVar114 * fVar135 + fVar116 * fStack_144;
                fVar81 = fVar112 * fVar133 + fVar114 * fVar138 + fVar116 * fStack_140;
                fVar79 = fVar121 * fVar130 + fVar122 * fVar129 + fVar123 * local_148;
                fVar97 = fVar121 * fVar132 + fVar122 * fVar135 + fVar123 * fStack_144;
                fVar94 = fVar121 * fVar133 + fVar122 * fVar138 + fVar123 * fStack_140;
                uVar71 = extraout_RDX_00;
                fVar104 = fVar121 * fVar134 + fVar122 * fVar96 + fVar123 * fStack_13c;
                fVar123 = fVar112 * fVar134 + fVar114 * fVar96 + fVar116 * fStack_13c;
                fVar110 = fVar127 * fVar130 + fVar98 * fVar129 + fVar108 * local_148 +
                          fVar103 * fVar111 + fVar125 * fVar105 + fVar128 * fVar110 +
                          local_188 + 0.0;
                fVar124 = fVar127 * fVar132 + fVar98 * fVar135 + fVar108 * fStack_144 +
                          fVar103 * fVar113 + fVar125 * fVar106 + fVar128 * fVar124 +
                          fStack_184 + 0.0;
                fVar126 = fVar127 * fVar133 + fVar98 * fVar138 + fVar108 * fStack_140 +
                          fVar103 * fVar115 + fVar125 * fVar107 + fVar128 * fVar126 +
                          (pAVar60->l).vy.field_0.m128[2] + 0.0;
                fVar103 = fVar127 * fVar134 + fVar98 * fVar96 + fVar108 * fStack_13c +
                          fVar103 * fVar118 + fVar125 * fVar109 + fVar128 * fVar95 + 0.0;
                fVar127 = fVar101 * fVar130 + fVar120 * fVar129 + fVar102 * local_148;
                fVar108 = fVar101 * fVar132 + fVar120 * fVar135 + fVar102 * fStack_144;
                fVar117 = fVar101 * fVar133 + fVar120 * fVar138 + fVar102 * fStack_140;
                fVar119 = fVar101 * fVar134 + fVar120 * fVar96 + fVar102 * fStack_13c;
              }
              else {
                bVar56 = bVar9 ^ 1U | bVar56;
                if (bVar56 == 0) {
                  local_e8 = ZEXT416((uint)(pAVar60->p).field_0.m128[3]);
                  local_c8 = ZEXT416((uint)(pAVar60->l).vx.field_0.m128[3]);
                  local_b8 = ZEXT416((uint)(pAVar60->l).vy.field_0.m128[3]);
                  local_f8 = ZEXT416((uint)(pAVar60->l).vz.field_0.m128[3]);
                  local_118 = (pAVar60->l).vy.field_0.m128[0];
                  fStack_114 = (pAVar60->l).vy.field_0.m128[1];
                  fStack_d0 = (pAVar60->l).vy.field_0.m128[2];
                  fStack_10c = (pAVar60->l).vy.field_0.m128[3];
                  local_108 = (pAVar60->l).vz.field_0.m128[0];
                  fStack_104 = (pAVar60->l).vz.field_0.m128[1];
                  fStack_100 = (pAVar60->l).vz.field_0.m128[2];
                  fStack_fc = (pAVar60->l).vz.field_0.m128[3];
                  local_98 = (pAVar60->l).vx.field_0.m128[0];
                  fStack_8c = (pAVar60->l).vx.field_0.m128[1];
                  pfVar1 = (float *)(lVar12 + -0x30 + lVar74);
                  fVar79 = *pfVar1;
                  fVar97 = pfVar1[1];
                  fVar123 = pfVar1[2];
                  pfVar1 = (float *)(lVar12 + -0x20 + lVar74);
                  fVar127 = *pfVar1;
                  fVar108 = pfVar1[1];
                  fVar117 = pfVar1[2];
                  puVar73 = (undefined8 *)(lVar12 + -0x10 + lVar74);
                  local_128 = *puVar73;
                  uStack_120 = puVar73[1];
                  pfVar1 = (float *)(lVar12 + lVar74);
                  fVar119 = *pfVar1;
                  fVar94 = pfVar1[1];
                  fVar104 = pfVar1[2];
                  fVar80 = fVar79 * local_98 + fVar97 * local_118 + fVar123 * local_108;
                  fVar110 = fVar79 * 0.0 + fVar97 * fStack_114 + fVar123 * fStack_104;
                  fVar79 = fVar79 * 0.0 + fVar97 * 0.0 + fVar123 * fStack_100;
                  local_148 = fVar127 * local_98 + fVar108 * local_118 + fVar117 * local_108;
                  fStack_144 = fVar127 * 0.0 + fVar108 * fStack_114 + fVar117 * fStack_104;
                  fStack_140 = fVar127 * 0.0 + fVar108 * 0.0 + fVar117 * fStack_100;
                  fStack_13c = fVar127 * fStack_8c + fVar108 * fStack_10c + fVar117 * fStack_fc;
                  fStack_110 = 0.0;
                  fStack_94 = 0.0;
                  fStack_90 = 0.0;
                  local_a8._0_4_ =
                       fVar119 * local_98 + fVar94 * local_118 + fVar104 * local_108 +
                       (pAVar60->p).field_0.m128[0];
                  local_a8._4_4_ =
                       fVar119 * 0.0 + fVar94 * fStack_114 + fVar104 * fStack_104 +
                       (pAVar60->p).field_0.m128[1];
                  fStack_a0 = fVar119 * 0.0 + fVar94 * 0.0 + fVar104 * fStack_100 +
                              (pAVar60->p).field_0.m128[2];
                  register0x0000128c =
                       fVar119 * fStack_8c + fVar94 * fStack_10c + fVar104 * fStack_fc +
                       (pAVar60->p).field_0.m128[3];
                  local_d8 = local_118;
                  fStack_d4 = fStack_114;
                  fStack_cc = fStack_10c;
                  if (((fVar110 != 0.0) || (NAN(fVar110))) ||
                     ((fVar79 != 0.0 ||
                      (((NAN(fVar79) || (fStack_140 != 0.0)) || (NAN(fStack_140))))))) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                               ,0x61);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                    std::ostream::put(-0x30);
                    std::ostream::flush();
                    uVar71 = extraout_RDX_02;
                  }
                  fVar79 = local_98 * (float)local_128 +
                           local_118 * local_128._4_4_ + local_108 * (float)uStack_120;
                  fVar97 = fStack_94 * (float)local_128 +
                           fStack_114 * local_128._4_4_ + fStack_104 * (float)uStack_120;
                  fVar94 = fStack_90 * (float)local_128 +
                           fStack_110 * local_128._4_4_ + fStack_100 * (float)uStack_120;
                  local_150 = true;
                  fVar104 = (float)local_f8._0_4_;
                  fVar123 = (float)local_c8._0_4_;
                  fVar110 = (float)local_a8._0_4_;
                  fVar124 = (float)local_a8._4_4_;
                  fVar126 = fStack_a0;
                  fVar103 = (float)local_e8._0_4_;
                  fVar127 = local_148;
                  fVar108 = fStack_144;
                  fVar117 = fStack_d0;
                  fVar119 = (float)local_b8._0_4_;
                }
                else {
                  if (((local_198 != 0.0) || (NAN(local_198))) ||
                     ((fVar81 != 0.0 ||
                      ((NAN(fVar81) ||
                       (uVar6 = *(undefined8 *)&(pAVar60->l).vz.field_0,
                       auVar18._4_4_ = -(uint)((pAVar60->l).vy.field_0.m128[0] != 0.0),
                       auVar18._0_4_ = -(uint)((pAVar60->l).vy.field_0.m128[2] != 0.0),
                       auVar18._8_4_ = -(uint)((float)uVar6 != 0.0),
                       auVar18._12_4_ = -(uint)((float)((ulong)uVar6 >> 0x20) != 0.0),
                       uVar57 = movmskps((int)CONCAT71(uVar69,bVar56),auVar18), (char)uVar57 != '\0'
                       )))))) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                               ,0x83);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                    std::ostream::put(-0x30);
                    std::ostream::flush();
                    uVar71 = extraout_RDX_01;
                  }
                  pfVar1 = (float *)(lVar12 + -0x30 + lVar74);
                  pfVar2 = (float *)(lVar12 + -0x20 + lVar74);
                  pfVar3 = (float *)(lVar12 + -0x10 + lVar74);
                  fVar79 = *pfVar3;
                  fVar97 = pfVar3[1];
                  pfVar5 = (float *)(lVar12 + lVar74);
                  uVar6 = *(undefined8 *)&(pAVar60->p).field_0;
                  fVar80 = (pAVar60->l).vx.field_0.m128[0] * *pfVar1;
                  local_198 = pfVar1[1] + (float)uVar6;
                  fVar81 = pfVar1[2] + (float)((ulong)uVar6 >> 0x20);
                  fVar94 = pfVar3[2] * (pAVar60->l).vz.field_0.m128[2];
                  local_150 = true;
                  fVar104 = pfVar3[3];
                  fVar123 = pfVar1[3];
                  fVar110 = *pfVar5;
                  fVar124 = pfVar5[1];
                  fVar126 = pfVar5[2];
                  fVar103 = pfVar5[3];
                  fVar127 = *pfVar2;
                  fVar108 = pfVar2[1] * (pAVar60->l).vy.field_0.m128[1];
                  fVar117 = pfVar2[2] + (pAVar60->p).field_0.m128[2];
                  fVar119 = pfVar2[3];
                }
              }
            }
          }
          else {
            auVar15._4_4_ = -(uint)((pAVar60->l).vy.field_0.m128[0] != 0.0);
            auVar15._0_4_ = -(uint)((pAVar60->l).vx.field_0.m128[3] != 0.0);
            auVar15._8_4_ = -(uint)((pAVar60->l).vy.field_0.m128[1] != 1.0);
            auVar15._12_4_ = -(uint)((pAVar60->l).vy.field_0.m128[2] != 0.0);
            uVar75 = movmskps(uVar75,auVar15);
            if ((((bVar9 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
               (((uVar75 & 4) != 0 ||
                (bVar70 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70),
                bVar70 != 0)))) goto LAB_0015e967;
            auVar16._4_4_ = -(uint)((pAVar60->l).vz.field_0.m128[0] != 0.0);
            auVar16._0_4_ = -(uint)((pAVar60->l).vy.field_0.m128[3] != 0.0);
            auVar16._8_4_ = -(uint)((pAVar60->l).vz.field_0.m128[1] != 0.0);
            auVar16._12_4_ = -(uint)((pAVar60->l).vz.field_0.m128[2] != 1.0);
            uVar75 = movmskps(uVar75,auVar16);
            if (((((bVar9 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0)) ||
               (bVar70 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70),
               bVar70 != 0)) goto LAB_0015e967;
            auVar17._4_4_ = -(uint)((pAVar60->p).field_0.m128[0] != 0.0);
            auVar17._0_4_ = -(uint)((pAVar60->l).vz.field_0.m128[3] != 0.0);
            auVar17._8_4_ = -(uint)((pAVar60->p).field_0.m128[1] != 0.0);
            auVar17._12_4_ = -(uint)((pAVar60->p).field_0.m128[2] != 0.0);
            uVar75 = movmskps(uVar75,auVar17);
            if ((((bVar9 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0))
            goto LAB_0015e967;
            bVar70 = ((byte)uVar75 & 8) >> 3;
            uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
            uVar71 = (ulong)uVar75;
            if ((bVar70 != 0) ||
               ((bVar9 != false &&
                ((fVar79 = (pAVar60->p).field_0.m128[3], fVar79 != 1.0 || (NAN(fVar79)))))))
            goto LAB_0015e967;
            pfVar1 = (float *)(lVar12 + -0x30 + lVar74);
            fVar80 = *pfVar1;
            local_198 = pfVar1[1];
            fVar81 = pfVar1[2];
            fVar123 = pfVar1[3];
            pfVar1 = (float *)(lVar12 + -0x20 + lVar74);
            fVar127 = *pfVar1;
            fVar108 = pfVar1[1];
            fVar117 = pfVar1[2];
            fVar119 = pfVar1[3];
            pfVar1 = (float *)(lVar12 + -0x10 + lVar74);
            fVar79 = *pfVar1;
            fVar97 = pfVar1[1];
            fVar94 = pfVar1[2];
            fVar104 = pfVar1[3];
            pfVar1 = (float *)(lVar12 + lVar74);
            fVar110 = *pfVar1;
            fVar124 = pfVar1[1];
            fVar126 = pfVar1[2];
            fVar103 = pfVar1[3];
            local_150 = (bool)bVar56;
          }
LAB_0015f0b1:
          pfVar1 = (float *)((long)local_158 + lVar74 + -0x30);
          *pfVar1 = fVar80;
          pfVar1[1] = local_198;
          pfVar1[2] = fVar81;
          pfVar1[3] = fVar123;
          pfVar1 = (float *)((long)local_158 + lVar74 + -0x20);
          *pfVar1 = fVar127;
          pfVar1[1] = fVar108;
          pfVar1[2] = fVar117;
          pfVar1[3] = fVar119;
          pfVar1 = (float *)((long)local_158 + lVar74 + -0x10);
          *pfVar1 = fVar79;
          pfVar1[1] = fVar97;
          pfVar1[2] = fVar94;
          pfVar1[3] = fVar104;
          pfVar1 = (float *)((long)&(local_158->l).vx.field_0 + lVar74);
          *pfVar1 = fVar110;
          pfVar1[1] = fVar124;
          pfVar1[2] = fVar126;
          pfVar1[3] = fVar103;
          uVar72 = uVar72 + 1;
          lVar74 = lVar74 + 0x40;
        } while (uVar72 < (ulong)plVar58[0xf]);
      }
    }
  }
  else {
    if (plVar58[0xf] == 1) {
      fVar79 = (spaces->time_range).lower;
      fVar81 = (spaces->time_range).upper;
      fVar97 = (float)plVar58[0xd];
      fVar123 = (float)((ulong)plVar58[0xd] >> 0x20);
      uVar75 = -(uint)(fVar79 < fVar97);
      uVar77 = -(uint)(fVar81 < fVar123);
      local_178._0_8_ =
           CONCAT44(~uVar77 & (uint)fVar123,~uVar75 & (uint)fVar79) |
           CONCAT44((uint)fVar81 & uVar77,(uint)fVar97 & uVar75);
      local_178._16_8_ = 0;
      sStack_160 = 0;
      local_158 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      if (sVar11 != 0) {
        local_158 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                    alignedMalloc(sVar11 << 6,0x10);
        pAVar60 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
        if (spaces->quaternion == false) {
          pAVar60 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                    (ulong)*(uint *)(plVar58 + 0x12);
        }
        local_150 = SUB81(pAVar60,0);
        local_178._16_8_ = sVar11;
        sStack_160 = sVar11;
        if ((spaces->spaces).size_active != 0) {
          lVar74 = 0x30;
          uVar72 = 0;
          uVar71 = extraout_RDX_16;
          do {
            uVar75 = (uint)uVar71;
            pAVar13 = (spaces->spaces).items;
            pfVar1 = (float *)plVar58[0x11];
            bVar9 = spaces->quaternion;
            uVar69 = (undefined7)((ulong)pAVar60 >> 8);
            uVar59 = CONCAT71(uVar69,bVar9);
            bVar56 = *(byte *)(plVar58 + 0x12);
            local_150 = false;
            fVar79 = *(float *)((long)pAVar13 + lVar74 + -0x30);
            uVar6 = *(undefined8 *)((long)pAVar13 + lVar74 + -0x2c);
            fVar81 = (float)((ulong)uVar6 >> 0x20);
            local_198 = (float)uVar6;
            if (((((fVar79 != 1.0) || (NAN(fVar79))) || (local_198 != 0.0)) ||
                ((NAN(local_198) || (fVar81 != 0.0)))) || (NAN(fVar81))) {
LAB_00161dcb:
              fVar97 = (float)*(undefined8 *)pfVar1;
              fVar123 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
              iVar76 = -(uint)(fVar97 != 1.0);
              iVar78 = -(uint)(fVar123 != 0.0);
              auVar91._4_4_ = iVar78;
              auVar91._0_4_ = iVar76;
              auVar91._8_4_ = iVar78;
              auVar91._12_4_ = iVar78;
              auVar90._8_8_ = auVar91._8_8_;
              auVar90._4_4_ = iVar76;
              auVar90._0_4_ = iVar76;
              uVar75 = movmskpd(uVar75,auVar90);
              fVar79 = pfVar1[2];
              if (((uVar75 & 1) == 0) &&
                 (((bVar70 = (byte)uVar75 >> 1, bVar70 == 0 && (fVar79 == 0.0)) && (!NAN(fVar79)))))
              {
                auVar41._4_4_ = -(uint)(pfVar1[4] != 0.0);
                auVar41._0_4_ = -(uint)(pfVar1[3] != 0.0);
                auVar41._8_4_ = -(uint)(pfVar1[5] != 1.0);
                auVar41._12_4_ = -(uint)(pfVar1[6] != 0.0);
                uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar41);
                if ((((bVar56 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                   (((uVar75 & 4) == 0 && (bVar70 = ((byte)uVar75 & 8) >> 3, bVar70 == 0)))) {
                  auVar42._4_4_ = -(uint)(pfVar1[8] != 0.0);
                  auVar42._0_4_ = -(uint)(pfVar1[7] != 0.0);
                  auVar42._8_4_ = -(uint)(pfVar1[9] != 0.0);
                  auVar42._12_4_ = -(uint)(pfVar1[10] != 1.0);
                  uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar42);
                  if ((((bVar56 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                     (((uVar75 & 4) == 0 && (bVar70 = ((byte)uVar75 & 8) >> 3, bVar70 == 0)))) {
                    auVar43._4_4_ = -(uint)(pfVar1[0xc] != 0.0);
                    auVar43._0_4_ = -(uint)(pfVar1[0xb] != 0.0);
                    auVar43._8_4_ = -(uint)(pfVar1[0xd] != 0.0);
                    auVar43._12_4_ = -(uint)(pfVar1[0xe] != 0.0);
                    uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar43);
                    if ((((((bVar56 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                         ((uVar75 & 4) == 0)) &&
                        (bVar70 = ((byte)uVar75 & 8) >> 3,
                        uVar71 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 == 0)) &&
                       ((bVar56 == 0 || ((pfVar1[0xf] == 1.0 && (!NAN(pfVar1[0xf]))))))) {
                      pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x30);
                      fVar80 = *pfVar1;
                      local_198 = pfVar1[1];
                      fVar81 = pfVar1[2];
                      fVar123 = pfVar1[3];
                      pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x20);
                      fVar127 = *pfVar1;
                      fVar108 = pfVar1[1];
                      fVar117 = pfVar1[2];
                      fVar119 = pfVar1[3];
                      pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x10);
                      fVar79 = *pfVar1;
                      fVar97 = pfVar1[1];
                      fVar94 = pfVar1[2];
                      fVar104 = pfVar1[3];
                      pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                      fVar110 = *pfVar1;
                      fVar124 = pfVar1[1];
                      fVar126 = pfVar1[2];
                      fVar103 = pfVar1[3];
                      local_150 = bVar9;
                      goto LAB_00162513;
                    }
                  }
                }
              }
              uVar71 = uVar59 & 0xffffffff;
              bVar70 = (byte)uVar71 | bVar56;
              uVar71 = CONCAT71((int7)(uVar71 >> 8),bVar70);
              if (bVar70 == 0) {
                pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x30);
                fVar126 = *pfVar2;
                fVar129 = pfVar2[1];
                fVar135 = pfVar2[2];
                fVar138 = pfVar2[3];
                pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x20);
                fVar95 = *pfVar2;
                fVar96 = pfVar2[1];
                fVar98 = pfVar2[2];
                fVar131 = pfVar2[3];
                pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x10);
                fVar99 = *pfVar2;
                fVar100 = pfVar2[1];
                fVar136 = pfVar2[2];
                fVar101 = pfVar2[3];
                fVar80 = fVar97 * fVar126 + fVar123 * fVar95 + fVar79 * fVar99;
                local_198 = fVar97 * fVar129 + fVar123 * fVar96 + fVar79 * fVar100;
                fVar81 = fVar97 * fVar135 + fVar123 * fVar98 + fVar79 * fVar136;
                fVar123 = fVar97 * fVar138 + fVar123 * fVar131 + fVar79 * fVar101;
                fVar79 = pfVar1[4];
                fVar97 = pfVar1[5];
                fVar119 = pfVar1[6];
                fVar104 = pfVar1[8];
                fVar127 = fVar79 * fVar126 + fVar97 * fVar95 + fVar119 * fVar99;
                fVar108 = fVar79 * fVar129 + fVar97 * fVar96 + fVar119 * fVar100;
                fVar117 = fVar79 * fVar135 + fVar97 * fVar98 + fVar119 * fVar136;
                fVar119 = fVar79 * fVar138 + fVar97 * fVar131 + fVar119 * fVar101;
                fVar110 = pfVar1[9];
                fVar124 = pfVar1[10];
                fVar79 = fVar104 * fVar126 + fVar110 * fVar95 + fVar124 * fVar99;
                fVar97 = fVar104 * fVar129 + fVar110 * fVar96 + fVar124 * fVar100;
                fVar94 = fVar104 * fVar135 + fVar110 * fVar98 + fVar124 * fVar136;
                fVar104 = fVar104 * fVar138 + fVar110 * fVar131 + fVar124 * fVar101;
                fVar103 = pfVar1[0xc];
                fVar125 = pfVar1[0xd];
                fVar128 = pfVar1[0xe];
                pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                fVar110 = fVar103 * fVar126 + fVar125 * fVar95 + fVar128 * fVar99 + *pfVar1;
                fVar124 = fVar103 * fVar129 + fVar125 * fVar96 + fVar128 * fVar100 + pfVar1[1];
                fVar126 = fVar103 * fVar135 + fVar125 * fVar98 + fVar128 * fVar136 + pfVar1[2];
                fVar103 = fVar103 * fVar138 + fVar125 * fVar131 + fVar128 * fVar101 + pfVar1[3];
              }
              else {
                uVar59 = uVar59 & 0xffffffff;
                bVar70 = (byte)uVar59 & bVar56;
                uVar71 = CONCAT71((int7)(uVar59 >> 8),bVar70);
                if (bVar70 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                             ,0x67);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                  std::ostream::put(-0x30);
                  std::ostream::flush();
                  fVar79 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar74 + 0xc);
                  fVar81 = *(float *)((long)pAVar13 + lVar74 + -0x24);
                  fVar97 = *(float *)((long)pAVar13 + lVar74 + -0x14);
                  fVar123 = *(float *)((long)pAVar13 + lVar74 + -4);
                  auVar8 = *(undefined1 (*) [16])((long)pAVar13 + lVar74 + -0x30);
                  pfVar3 = (float *)((long)pAVar13 + lVar74 + -0x20);
                  fVar80 = *pfVar3;
                  fVar127 = pfVar3[1];
                  pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x10);
                  fVar108 = *pfVar2;
                  fVar117 = pfVar2[1];
                  fVar119 = pfVar2[2];
                  fVar129 = fVar81 * fVar97 + fVar79 * fVar123;
                  fVar104 = fVar81 * fVar97 - fVar79 * fVar123;
                  fVar110 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                            -fVar123 * fVar123;
                  fVar124 = fVar79 * fVar79 - fVar81 * fVar81;
                  fVar126 = fVar97 * fVar97 + fVar124 + -fVar123 * fVar123;
                  fVar138 = fVar81 * fVar123 - fVar79 * fVar97;
                  fVar94 = fVar79 * fVar97 + fVar81 * fVar123;
                  fVar135 = fVar97 * fVar123 + fVar79 * fVar81;
                  fVar79 = fVar97 * fVar123 - fVar79 * fVar81;
                  pfVar2 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                  fVar103 = *pfVar2;
                  fVar125 = pfVar2[1];
                  fVar128 = pfVar2[2];
                  fVar129 = fVar129 + fVar129;
                  fVar138 = fVar138 + fVar138;
                  fVar104 = fVar104 + fVar104;
                  fVar135 = fVar135 + fVar135;
                  fVar94 = fVar94 + fVar94;
                  fVar79 = fVar79 + fVar79;
                  fVar81 = fVar123 * fVar123 + fVar124 + -fVar97 * fVar97;
                  fVar111 = fVar110 * 1.0 + fVar129 * 0.0 + fVar138 * 0.0;
                  fVar113 = fVar110 * 0.0 + fVar129 * 1.0 + fVar138 * 0.0;
                  fVar115 = fVar110 * 0.0 + fVar129 * 0.0 + fVar138 * 1.0;
                  fVar118 = fVar110 * 0.0 + fVar129 * 0.0 + fVar138 * 0.0;
                  fVar105 = fVar104 * 1.0 + fVar126 * 0.0 + fVar135 * 0.0;
                  fVar106 = fVar104 * 0.0 + fVar126 * 1.0 + fVar135 * 0.0;
                  fVar107 = fVar104 * 0.0 + fVar126 * 0.0 + fVar135 * 1.0;
                  fVar109 = fVar104 * 0.0 + fVar126 * 0.0 + fVar135 * 0.0;
                  fVar110 = fVar94 * 1.0 + fVar79 * 0.0 + fVar81 * 0.0;
                  fVar124 = fVar94 * 0.0 + fVar79 * 1.0 + fVar81 * 0.0;
                  fVar126 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 1.0;
                  fVar95 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 0.0;
                  local_188 = auVar8._4_4_;
                  fStack_184 = auVar8._8_4_;
                  local_198 = auVar8._0_4_;
                  fVar130 = local_198 * fVar111 + fVar105 * 0.0 + fVar110 * 0.0;
                  fVar132 = local_198 * fVar113 + fVar106 * 0.0 + fVar124 * 0.0;
                  fVar133 = local_198 * fVar115 + fVar107 * 0.0 + fVar126 * 0.0;
                  fVar134 = local_198 * fVar118 + fVar109 * 0.0 + fVar95 * 0.0;
                  fVar129 = fVar80 * fVar111 + fVar127 * fVar105 + fVar110 * 0.0;
                  fVar135 = fVar80 * fVar113 + fVar127 * fVar106 + fVar124 * 0.0;
                  fVar138 = fVar80 * fVar115 + fVar127 * fVar107 + fVar126 * 0.0;
                  fVar96 = fVar80 * fVar118 + fVar127 * fVar109 + fVar95 * 0.0;
                  local_148 = fVar108 * fVar111 + fVar117 * fVar105 + fVar119 * fVar110;
                  fStack_144 = fVar108 * fVar113 + fVar117 * fVar106 + fVar119 * fVar124;
                  fStack_140 = fVar108 * fVar115 + fVar117 * fVar107 + fVar119 * fVar126;
                  fStack_13c = fVar108 * fVar118 + fVar117 * fVar109 + fVar119 * fVar95;
                  fVar79 = pfVar1[0xf];
                  fVar81 = pfVar1[3];
                  fVar97 = pfVar1[7];
                  fVar123 = pfVar1[0xb];
                  fVar131 = fVar81 * fVar97 + fVar79 * fVar123;
                  fVar104 = fVar81 * fVar97 - fVar79 * fVar123;
                  fVar98 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 + -fVar123 * fVar123
                  ;
                  fVar127 = fVar79 * fVar79 - fVar81 * fVar81;
                  fVar137 = fVar97 * fVar97 + fVar127 + -fVar123 * fVar123;
                  fVar136 = fVar81 * fVar123 - fVar79 * fVar97;
                  fVar101 = fVar79 * fVar97 + fVar81 * fVar123;
                  fVar139 = fVar97 * fVar123 + fVar79 * fVar81;
                  fVar94 = fVar97 * fVar123 - fVar79 * fVar81;
                  fVar79 = *pfVar1;
                  fVar81 = pfVar1[4];
                  fVar80 = pfVar1[5];
                  fVar120 = fVar123 * fVar123 + fVar127 + -fVar97 * fVar97;
                  fVar97 = pfVar1[8];
                  fVar123 = pfVar1[9];
                  fVar127 = pfVar1[10];
                  fVar131 = fVar131 + fVar131;
                  fVar136 = fVar136 + fVar136;
                  fVar108 = pfVar1[0xc];
                  fVar117 = pfVar1[0xd];
                  fVar119 = pfVar1[0xe];
                  fVar99 = fVar98 * 1.0 + fVar131 * 0.0 + fVar136 * 0.0;
                  fVar100 = fVar98 * 0.0 + fVar131 * 1.0 + fVar136 * 0.0;
                  fVar136 = fVar98 * 0.0 + fVar131 * 0.0 + fVar136 * 1.0;
                  fVar104 = fVar104 + fVar104;
                  fVar139 = fVar139 + fVar139;
                  fVar101 = fVar101 + fVar101;
                  fVar94 = fVar94 + fVar94;
                  fVar98 = fVar104 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
                  fVar131 = fVar104 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
                  fVar104 = fVar104 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
                  fVar137 = fVar101 * 1.0 + fVar94 * 0.0 + fVar120 * 0.0;
                  fVar139 = fVar101 * 0.0 + fVar94 * 1.0 + fVar120 * 0.0;
                  fVar94 = fVar101 * 0.0 + fVar94 * 0.0 + fVar120 * 1.0;
                  fVar112 = fVar79 * fVar99 + fVar98 * 0.0 + fVar137 * 0.0;
                  fVar114 = fVar79 * fVar100 + fVar131 * 0.0 + fVar139 * 0.0;
                  fVar116 = fVar79 * fVar136 + fVar104 * 0.0 + fVar94 * 0.0;
                  fVar101 = fVar81 * fVar99 + fVar80 * fVar98 + fVar137 * 0.0;
                  fVar120 = fVar81 * fVar100 + fVar80 * fVar131 + fVar139 * 0.0;
                  fVar102 = fVar81 * fVar136 + fVar80 * fVar104 + fVar94 * 0.0;
                  fVar121 = fVar97 * fVar99 + fVar123 * fVar98 + fVar127 * fVar137;
                  fVar122 = fVar97 * fVar100 + fVar123 * fVar131 + fVar127 * fVar139;
                  fVar123 = fVar97 * fVar136 + fVar123 * fVar104 + fVar127 * fVar94;
                  fVar127 = fVar108 * fVar99 + fVar117 * fVar98 + fVar119 * fVar137 +
                            pfVar1[1] + 0.0;
                  fVar98 = fVar108 * fVar100 + fVar117 * fVar131 + fVar119 * fVar139 +
                           pfVar1[2] + 0.0;
                  fVar108 = fVar108 * fVar136 + fVar117 * fVar104 + fVar119 * fVar94 +
                            pfVar1[6] + 0.0;
                  fVar80 = fVar112 * fVar130 + fVar114 * fVar129 + fVar116 * local_148;
                  local_198 = fVar112 * fVar132 + fVar114 * fVar135 + fVar116 * fStack_144;
                  fVar81 = fVar112 * fVar133 + fVar114 * fVar138 + fVar116 * fStack_140;
                  fVar79 = fVar121 * fVar130 + fVar122 * fVar129 + fVar123 * local_148;
                  fVar97 = fVar121 * fVar132 + fVar122 * fVar135 + fVar123 * fStack_144;
                  fVar94 = fVar121 * fVar133 + fVar122 * fVar138 + fVar123 * fStack_140;
                  uVar71 = extraout_RDX_17;
                  fVar104 = fVar121 * fVar134 + fVar122 * fVar96 + fVar123 * fStack_13c;
                  fVar123 = fVar112 * fVar134 + fVar114 * fVar96 + fVar116 * fStack_13c;
                  fVar110 = fVar127 * fVar130 + fVar98 * fVar129 + fVar108 * local_148 +
                            fVar103 * fVar111 + fVar125 * fVar105 + fVar128 * fVar110 +
                            local_188 + 0.0;
                  fVar124 = fVar127 * fVar132 + fVar98 * fVar135 + fVar108 * fStack_144 +
                            fVar103 * fVar113 + fVar125 * fVar106 + fVar128 * fVar124 +
                            fStack_184 + 0.0;
                  fVar126 = fVar127 * fVar133 + fVar98 * fVar138 + fVar108 * fStack_140 +
                            fVar103 * fVar115 + fVar125 * fVar107 + fVar128 * fVar126 +
                            pfVar3[2] + 0.0;
                  fVar103 = fVar127 * fVar134 + fVar98 * fVar96 + fVar108 * fStack_13c +
                            fVar103 * fVar118 + fVar125 * fVar109 + fVar128 * fVar95 + 0.0;
                  fVar127 = fVar101 * fVar130 + fVar120 * fVar129 + fVar102 * local_148;
                  fVar108 = fVar101 * fVar132 + fVar120 * fVar135 + fVar102 * fStack_144;
                  fVar117 = fVar101 * fVar133 + fVar120 * fVar138 + fVar102 * fStack_140;
                  fVar119 = fVar101 * fVar134 + fVar120 * fVar96 + fVar102 * fStack_13c;
                }
                else {
                  bVar56 = bVar9 ^ 1U | bVar56;
                  if (bVar56 == 0) {
                    local_e8 = ZEXT416(*(uint *)((long)&(pAVar13->l).vx.field_0 + lVar74 + 0xc));
                    local_c8 = ZEXT416(*(uint *)((long)pAVar13 + lVar74 + -0x24));
                    local_b8 = ZEXT416(*(uint *)((long)pAVar13 + lVar74 + -0x14));
                    local_f8 = ZEXT416(*(uint *)((long)pAVar13 + lVar74 + -4));
                    pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x20);
                    local_118 = *pfVar2;
                    fStack_114 = pfVar2[1];
                    fStack_d0 = pfVar2[2];
                    fStack_10c = pfVar2[3];
                    pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x10);
                    local_108 = *pfVar2;
                    fStack_104 = pfVar2[1];
                    fStack_100 = pfVar2[2];
                    fStack_fc = pfVar2[3];
                    pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x30);
                    local_98 = *pfVar2;
                    fStack_8c = pfVar2[1];
                    fVar79 = *pfVar1;
                    fVar97 = pfVar1[1];
                    fVar123 = pfVar1[2];
                    fVar127 = pfVar1[4];
                    fVar108 = pfVar1[5];
                    fVar117 = pfVar1[6];
                    local_128 = *(undefined8 *)(pfVar1 + 8);
                    uStack_120 = *(undefined8 *)(pfVar1 + 10);
                    fVar119 = pfVar1[0xc];
                    fVar94 = pfVar1[0xd];
                    fVar104 = pfVar1[0xe];
                    fVar80 = fVar79 * local_98 + fVar97 * local_118 + fVar123 * local_108;
                    fVar110 = fVar79 * 0.0 + fVar97 * fStack_114 + fVar123 * fStack_104;
                    fVar79 = fVar79 * 0.0 + fVar97 * 0.0 + fVar123 * fStack_100;
                    local_148 = fVar127 * local_98 + fVar108 * local_118 + fVar117 * local_108;
                    fStack_144 = fVar127 * 0.0 + fVar108 * fStack_114 + fVar117 * fStack_104;
                    fStack_140 = fVar127 * 0.0 + fVar108 * 0.0 + fVar117 * fStack_100;
                    fStack_13c = fVar127 * fStack_8c + fVar108 * fStack_10c + fVar117 * fStack_fc;
                    fStack_110 = 0.0;
                    fStack_94 = 0.0;
                    fStack_90 = 0.0;
                    pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                    local_a8._0_4_ =
                         fVar119 * local_98 + fVar94 * local_118 + fVar104 * local_108 + *pfVar1;
                    local_a8._4_4_ =
                         fVar119 * 0.0 + fVar94 * fStack_114 + fVar104 * fStack_104 + pfVar1[1];
                    fStack_a0 = fVar119 * 0.0 + fVar94 * 0.0 + fVar104 * fStack_100 + pfVar1[2];
                    register0x0000128c =
                         fVar119 * fStack_8c + fVar94 * fStack_10c + fVar104 * fStack_fc + pfVar1[3]
                    ;
                    local_d8 = local_118;
                    fStack_d4 = fStack_114;
                    fStack_cc = fStack_10c;
                    if (((fVar110 != 0.0) || (NAN(fVar110))) ||
                       ((fVar79 != 0.0 ||
                        (((NAN(fVar79) || (fStack_140 != 0.0)) || (NAN(fStack_140))))))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                 ,0x61);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                      std::ostream::put(-0x30);
                      std::ostream::flush();
                      uVar71 = extraout_RDX_19;
                    }
                    fVar79 = local_98 * (float)local_128 +
                             local_118 * local_128._4_4_ + local_108 * (float)uStack_120;
                    fVar97 = fStack_94 * (float)local_128 +
                             fStack_114 * local_128._4_4_ + fStack_104 * (float)uStack_120;
                    fVar94 = fStack_90 * (float)local_128 +
                             fStack_110 * local_128._4_4_ + fStack_100 * (float)uStack_120;
                    local_150 = true;
                    fVar104 = (float)local_f8._0_4_;
                    fVar123 = (float)local_c8._0_4_;
                    fVar110 = (float)local_a8._0_4_;
                    fVar124 = (float)local_a8._4_4_;
                    fVar126 = fStack_a0;
                    fVar103 = (float)local_e8._0_4_;
                    fVar127 = local_148;
                    fVar108 = fStack_144;
                    fVar117 = fStack_d0;
                    fVar119 = (float)local_b8._0_4_;
                  }
                  else {
                    if (((local_198 != 0.0) || (NAN(local_198))) ||
                       ((fVar81 != 0.0 ||
                        ((NAN(fVar81) ||
                         (uVar6 = *(undefined8 *)((long)pAVar13 + lVar74 + -0x10),
                         auVar22._4_4_ = -(uint)(*(float *)((long)pAVar13 + lVar74 + -0x20) != 0.0),
                         auVar22._0_4_ = -(uint)(*(float *)((long)pAVar13 + lVar74 + -0x18) != 0.0),
                         auVar22._8_4_ = -(uint)((float)uVar6 != 0.0),
                         auVar22._12_4_ = -(uint)((float)((ulong)uVar6 >> 0x20) != 0.0),
                         uVar57 = movmskps((int)CONCAT71(uVar69,bVar56),auVar22),
                         (char)uVar57 != '\0')))))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                 ,0x83);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                      std::ostream::put(-0x30);
                      std::ostream::flush();
                      uVar71 = extraout_RDX_18;
                    }
                    fVar79 = pfVar1[8];
                    fVar97 = pfVar1[9];
                    uVar6 = *(undefined8 *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                    fVar80 = *(float *)((long)pAVar13 + lVar74 + -0x30) * *pfVar1;
                    local_198 = pfVar1[1] + (float)uVar6;
                    fVar81 = pfVar1[2] + (float)((ulong)uVar6 >> 0x20);
                    fVar94 = pfVar1[10] * *(float *)((long)pAVar13 + lVar74 + -8);
                    local_150 = true;
                    fVar104 = pfVar1[0xb];
                    fVar123 = pfVar1[3];
                    fVar110 = pfVar1[0xc];
                    fVar124 = pfVar1[0xd];
                    fVar126 = pfVar1[0xe];
                    fVar103 = pfVar1[0xf];
                    fVar127 = pfVar1[4];
                    fVar108 = pfVar1[5] * *(float *)((long)pAVar13 + lVar74 + -0x1c);
                    fVar117 = pfVar1[6] + *(float *)((long)&(pAVar13->l).vx.field_0 + lVar74 + 8);
                    fVar119 = pfVar1[7];
                  }
                }
              }
            }
            else {
              pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x24);
              auVar19._4_4_ = -(uint)(pfVar2[1] != 0.0);
              auVar19._0_4_ = -(uint)(*pfVar2 != 0.0);
              auVar19._8_4_ = -(uint)(pfVar2[2] != 1.0);
              auVar19._12_4_ = -(uint)(pfVar2[3] != 0.0);
              uVar75 = movmskps(uVar75,auVar19);
              if ((((bVar9 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                 (((uVar75 & 4) != 0 ||
                  (bVar70 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70),
                  bVar70 != 0)))) goto LAB_00161dcb;
              pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x14);
              auVar20._4_4_ = -(uint)(pfVar2[1] != 0.0);
              auVar20._0_4_ = -(uint)(*pfVar2 != 0.0);
              auVar20._8_4_ = -(uint)(pfVar2[2] != 0.0);
              auVar20._12_4_ = -(uint)(pfVar2[3] != 1.0);
              uVar75 = movmskps(uVar75,auVar20);
              if (((((bVar9 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0)) ||
                 (bVar70 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70),
                 bVar70 != 0)) goto LAB_00161dcb;
              pfVar2 = (float *)((long)pAVar13 + lVar74 + -4);
              auVar21._4_4_ = -(uint)(pfVar2[1] != 0.0);
              auVar21._0_4_ = -(uint)(*pfVar2 != 0.0);
              auVar21._8_4_ = -(uint)(pfVar2[2] != 0.0);
              auVar21._12_4_ = -(uint)(pfVar2[3] != 0.0);
              uVar75 = movmskps(uVar75,auVar21);
              if ((((bVar9 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0))
              goto LAB_00161dcb;
              bVar70 = ((byte)uVar75 & 8) >> 3;
              uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
              uVar71 = (ulong)uVar75;
              if ((bVar70 != 0) ||
                 ((bVar9 != false &&
                  ((fVar79 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar74 + 0xc),
                   fVar79 != 1.0 || (NAN(fVar79))))))) goto LAB_00161dcb;
              fVar80 = *pfVar1;
              local_198 = pfVar1[1];
              fVar81 = pfVar1[2];
              fVar123 = pfVar1[3];
              fVar127 = pfVar1[4];
              fVar108 = pfVar1[5];
              fVar117 = pfVar1[6];
              fVar119 = pfVar1[7];
              fVar79 = pfVar1[8];
              fVar97 = pfVar1[9];
              fVar94 = pfVar1[10];
              fVar104 = pfVar1[0xb];
              fVar110 = pfVar1[0xc];
              fVar124 = pfVar1[0xd];
              fVar126 = pfVar1[0xe];
              fVar103 = pfVar1[0xf];
              local_150 = (bool)bVar56;
            }
LAB_00162513:
            pfVar1 = (float *)((long)local_158 + lVar74 + -0x30);
            *pfVar1 = fVar80;
            pfVar1[1] = local_198;
            pfVar1[2] = fVar81;
            pfVar1[3] = fVar123;
            pfVar1 = (float *)((long)local_158 + lVar74 + -0x20);
            *pfVar1 = fVar127;
            pfVar1[1] = fVar108;
            pfVar1[2] = fVar117;
            pfVar1[3] = fVar119;
            pfVar1 = (float *)((long)local_158 + lVar74 + -0x10);
            *pfVar1 = fVar79;
            pfVar1[1] = fVar97;
            pfVar1[2] = fVar94;
            pfVar1[3] = fVar104;
            pfVar1 = (float *)((long)&(local_158->l).vx.field_0 + lVar74);
            *pfVar1 = fVar110;
            pfVar1[1] = fVar124;
            pfVar1[2] = fVar126;
            pfVar1[3] = fVar103;
            uVar72 = uVar72 + 1;
            lVar74 = lVar74 + 0x40;
            pAVar60 = local_158;
          } while (uVar72 < (spaces->spaces).size_active);
        }
        goto LAB_00163677;
      }
    }
    else {
      if (sVar11 != plVar58[0xf]) {
        prVar68 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar68,"number of transformations does not match");
        __cxa_throw(prVar68,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      fVar79 = (spaces->time_range).lower;
      fVar81 = (spaces->time_range).upper;
      fVar97 = (float)plVar58[0xd];
      fVar123 = (float)((ulong)plVar58[0xd] >> 0x20);
      uVar75 = -(uint)(fVar79 < fVar97);
      uVar77 = -(uint)(fVar81 < fVar123);
      local_178._0_8_ =
           CONCAT44(~uVar77 & (uint)fVar123,~uVar75 & (uint)fVar79) |
           CONCAT44((uint)fVar81 & uVar77,(uint)fVar97 & uVar75);
      local_178._16_8_ = 0;
      sStack_160 = 0;
      local_158 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      if (sVar11 != 0) {
        local_158 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                    alignedMalloc(sVar11 << 6,0x10);
        pAVar60 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
        if (spaces->quaternion == false) {
          pAVar60 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                    (ulong)*(uint *)(plVar58 + 0x12);
        }
        local_150 = SUB81(pAVar60,0);
        local_178._16_8_ = sVar11;
        sStack_160 = sVar11;
        if ((spaces->spaces).size_active != 0) {
          lVar74 = 0x30;
          uVar72 = 0;
          uVar71 = extraout_RDX_20;
          do {
            uVar75 = (uint)uVar71;
            pAVar13 = (spaces->spaces).items;
            lVar12 = plVar58[0x11];
            bVar9 = spaces->quaternion;
            uVar69 = (undefined7)((ulong)pAVar60 >> 8);
            uVar59 = CONCAT71(uVar69,bVar9);
            bVar56 = *(byte *)(plVar58 + 0x12);
            local_150 = false;
            fVar79 = *(float *)((long)pAVar13 + lVar74 + -0x30);
            uVar6 = *(undefined8 *)((long)pAVar13 + lVar74 + -0x2c);
            fVar81 = (float)((ulong)uVar6 >> 0x20);
            local_198 = (float)uVar6;
            if ((((fVar79 != 1.0) || (NAN(fVar79))) || (local_198 != 0.0)) ||
               (((NAN(local_198) || (fVar81 != 0.0)) || (NAN(fVar81))))) {
LAB_00162abf:
              uVar6 = *(undefined8 *)(lVar12 + -0x30 + lVar74);
              fVar97 = (float)uVar6;
              fVar123 = (float)((ulong)uVar6 >> 0x20);
              iVar76 = -(uint)(fVar97 != 1.0);
              iVar78 = -(uint)(fVar123 != 0.0);
              auVar93._4_4_ = iVar78;
              auVar93._0_4_ = iVar76;
              auVar93._8_4_ = iVar78;
              auVar93._12_4_ = iVar78;
              auVar92._8_8_ = auVar93._8_8_;
              auVar92._4_4_ = iVar76;
              auVar92._0_4_ = iVar76;
              uVar75 = movmskpd(uVar75,auVar92);
              fVar79 = *(float *)(lVar12 + -0x28 + lVar74);
              if (((uVar75 & 1) == 0) &&
                 (((bVar70 = (byte)uVar75 >> 1, bVar70 == 0 && (fVar79 == 0.0)) && (!NAN(fVar79)))))
              {
                pfVar1 = (float *)(lVar12 + -0x24 + lVar74);
                auVar44._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar44._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar44._8_4_ = -(uint)(pfVar1[2] != 1.0);
                auVar44._12_4_ = -(uint)(pfVar1[3] != 0.0);
                uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar44);
                if ((((bVar56 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                   (((uVar75 & 4) == 0 && (bVar70 = ((byte)uVar75 & 8) >> 3, bVar70 == 0)))) {
                  pfVar1 = (float *)(lVar12 + -0x14 + lVar74);
                  auVar45._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar45._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar45._8_4_ = -(uint)(pfVar1[2] != 0.0);
                  auVar45._12_4_ = -(uint)(pfVar1[3] != 1.0);
                  uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar45);
                  if ((((bVar56 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                     (((uVar75 & 4) == 0 && (bVar70 = ((byte)uVar75 & 8) >> 3, bVar70 == 0)))) {
                    pfVar1 = (float *)(lVar12 + -4 + lVar74);
                    auVar46._4_4_ = -(uint)(pfVar1[1] != 0.0);
                    auVar46._0_4_ = -(uint)(*pfVar1 != 0.0);
                    auVar46._8_4_ = -(uint)(pfVar1[2] != 0.0);
                    auVar46._12_4_ = -(uint)(pfVar1[3] != 0.0);
                    uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar70),auVar46);
                    if ((((((bVar56 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                         ((uVar75 & 4) == 0)) &&
                        (bVar70 = ((byte)uVar75 & 8) >> 3,
                        uVar71 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar70), bVar70 == 0)) &&
                       ((bVar56 == 0 ||
                        ((fVar80 = *(float *)(lVar12 + 0xc + lVar74), fVar80 == 1.0 &&
                         (!NAN(fVar80))))))) {
                      pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x30);
                      fVar80 = *pfVar1;
                      local_198 = pfVar1[1];
                      fVar81 = pfVar1[2];
                      fVar123 = pfVar1[3];
                      pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x20);
                      fVar127 = *pfVar1;
                      fVar108 = pfVar1[1];
                      fVar117 = pfVar1[2];
                      fVar119 = pfVar1[3];
                      pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x10);
                      fVar79 = *pfVar1;
                      fVar97 = pfVar1[1];
                      fVar94 = pfVar1[2];
                      fVar104 = pfVar1[3];
                      pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                      fVar110 = *pfVar1;
                      fVar124 = pfVar1[1];
                      fVar126 = pfVar1[2];
                      fVar103 = pfVar1[3];
                      local_150 = bVar9;
                      goto LAB_0016321e;
                    }
                  }
                }
              }
              uVar71 = uVar59 & 0xffffffff;
              bVar70 = (byte)uVar71 | bVar56;
              uVar71 = CONCAT71((int7)(uVar71 >> 8),bVar70);
              if (bVar70 == 0) {
                pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x30);
                fVar126 = *pfVar1;
                fVar129 = pfVar1[1];
                fVar135 = pfVar1[2];
                fVar138 = pfVar1[3];
                pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x20);
                fVar95 = *pfVar1;
                fVar96 = pfVar1[1];
                fVar98 = pfVar1[2];
                fVar131 = pfVar1[3];
                pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x10);
                fVar99 = *pfVar1;
                fVar100 = pfVar1[1];
                fVar136 = pfVar1[2];
                fVar101 = pfVar1[3];
                fVar80 = fVar97 * fVar126 + fVar123 * fVar95 + fVar79 * fVar99;
                local_198 = fVar97 * fVar129 + fVar123 * fVar96 + fVar79 * fVar100;
                fVar81 = fVar97 * fVar135 + fVar123 * fVar98 + fVar79 * fVar136;
                fVar123 = fVar97 * fVar138 + fVar123 * fVar131 + fVar79 * fVar101;
                fVar79 = *(float *)(lVar12 + -0x20 + lVar74);
                fVar97 = *(float *)(lVar12 + -0x1c + lVar74);
                fVar119 = *(float *)(lVar12 + -0x18 + lVar74);
                fVar104 = *(float *)(lVar12 + -0x10 + lVar74);
                fVar127 = fVar79 * fVar126 + fVar97 * fVar95 + fVar119 * fVar99;
                fVar108 = fVar79 * fVar129 + fVar97 * fVar96 + fVar119 * fVar100;
                fVar117 = fVar79 * fVar135 + fVar97 * fVar98 + fVar119 * fVar136;
                fVar119 = fVar79 * fVar138 + fVar97 * fVar131 + fVar119 * fVar101;
                fVar110 = *(float *)(lVar12 + -0xc + lVar74);
                fVar124 = *(float *)(lVar12 + -8 + lVar74);
                fVar79 = fVar104 * fVar126 + fVar110 * fVar95 + fVar124 * fVar99;
                fVar97 = fVar104 * fVar129 + fVar110 * fVar96 + fVar124 * fVar100;
                fVar94 = fVar104 * fVar135 + fVar110 * fVar98 + fVar124 * fVar136;
                fVar104 = fVar104 * fVar138 + fVar110 * fVar131 + fVar124 * fVar101;
                fVar103 = *(float *)(lVar12 + lVar74);
                fVar125 = *(float *)(lVar12 + 4 + lVar74);
                fVar128 = *(float *)(lVar12 + 8 + lVar74);
                pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                fVar110 = fVar103 * fVar126 + fVar125 * fVar95 + fVar128 * fVar99 + *pfVar1;
                fVar124 = fVar103 * fVar129 + fVar125 * fVar96 + fVar128 * fVar100 + pfVar1[1];
                fVar126 = fVar103 * fVar135 + fVar125 * fVar98 + fVar128 * fVar136 + pfVar1[2];
                fVar103 = fVar103 * fVar138 + fVar125 * fVar131 + fVar128 * fVar101 + pfVar1[3];
              }
              else {
                uVar59 = uVar59 & 0xffffffff;
                bVar70 = (byte)uVar59 & bVar56;
                uVar71 = CONCAT71((int7)(uVar59 >> 8),bVar70);
                if (bVar70 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                             ,0x67);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                  std::ostream::put(-0x30);
                  std::ostream::flush();
                  fVar79 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar74 + 0xc);
                  fVar81 = *(float *)((long)pAVar13 + lVar74 + -0x24);
                  fVar97 = *(float *)((long)pAVar13 + lVar74 + -0x14);
                  fVar123 = *(float *)((long)pAVar13 + lVar74 + -4);
                  auVar8 = *(undefined1 (*) [16])((long)pAVar13 + lVar74 + -0x30);
                  pfVar2 = (float *)((long)pAVar13 + lVar74 + -0x20);
                  fVar80 = *pfVar2;
                  fVar127 = pfVar2[1];
                  pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x10);
                  fVar108 = *pfVar1;
                  fVar117 = pfVar1[1];
                  fVar119 = pfVar1[2];
                  fVar129 = fVar81 * fVar97 + fVar79 * fVar123;
                  fVar104 = fVar81 * fVar97 - fVar79 * fVar123;
                  fVar110 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                            -fVar123 * fVar123;
                  fVar124 = fVar79 * fVar79 - fVar81 * fVar81;
                  fVar126 = fVar97 * fVar97 + fVar124 + -fVar123 * fVar123;
                  fVar138 = fVar81 * fVar123 - fVar79 * fVar97;
                  fVar94 = fVar79 * fVar97 + fVar81 * fVar123;
                  fVar135 = fVar97 * fVar123 + fVar79 * fVar81;
                  fVar79 = fVar97 * fVar123 - fVar79 * fVar81;
                  pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                  fVar103 = *pfVar1;
                  fVar125 = pfVar1[1];
                  fVar128 = pfVar1[2];
                  fVar129 = fVar129 + fVar129;
                  fVar138 = fVar138 + fVar138;
                  fVar104 = fVar104 + fVar104;
                  fVar135 = fVar135 + fVar135;
                  fVar94 = fVar94 + fVar94;
                  fVar79 = fVar79 + fVar79;
                  fVar81 = fVar123 * fVar123 + fVar124 + -fVar97 * fVar97;
                  fVar111 = fVar110 * 1.0 + fVar129 * 0.0 + fVar138 * 0.0;
                  fVar113 = fVar110 * 0.0 + fVar129 * 1.0 + fVar138 * 0.0;
                  fVar115 = fVar110 * 0.0 + fVar129 * 0.0 + fVar138 * 1.0;
                  fVar118 = fVar110 * 0.0 + fVar129 * 0.0 + fVar138 * 0.0;
                  fVar105 = fVar104 * 1.0 + fVar126 * 0.0 + fVar135 * 0.0;
                  fVar106 = fVar104 * 0.0 + fVar126 * 1.0 + fVar135 * 0.0;
                  fVar107 = fVar104 * 0.0 + fVar126 * 0.0 + fVar135 * 1.0;
                  fVar109 = fVar104 * 0.0 + fVar126 * 0.0 + fVar135 * 0.0;
                  fVar110 = fVar94 * 1.0 + fVar79 * 0.0 + fVar81 * 0.0;
                  fVar124 = fVar94 * 0.0 + fVar79 * 1.0 + fVar81 * 0.0;
                  fVar126 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 1.0;
                  fVar95 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 0.0;
                  local_188 = auVar8._4_4_;
                  fStack_184 = auVar8._8_4_;
                  local_198 = auVar8._0_4_;
                  fVar130 = local_198 * fVar111 + fVar105 * 0.0 + fVar110 * 0.0;
                  fVar132 = local_198 * fVar113 + fVar106 * 0.0 + fVar124 * 0.0;
                  fVar133 = local_198 * fVar115 + fVar107 * 0.0 + fVar126 * 0.0;
                  fVar134 = local_198 * fVar118 + fVar109 * 0.0 + fVar95 * 0.0;
                  fVar129 = fVar80 * fVar111 + fVar127 * fVar105 + fVar110 * 0.0;
                  fVar135 = fVar80 * fVar113 + fVar127 * fVar106 + fVar124 * 0.0;
                  fVar138 = fVar80 * fVar115 + fVar127 * fVar107 + fVar126 * 0.0;
                  fVar96 = fVar80 * fVar118 + fVar127 * fVar109 + fVar95 * 0.0;
                  local_148 = fVar108 * fVar111 + fVar117 * fVar105 + fVar119 * fVar110;
                  fStack_144 = fVar108 * fVar113 + fVar117 * fVar106 + fVar119 * fVar124;
                  fStack_140 = fVar108 * fVar115 + fVar117 * fVar107 + fVar119 * fVar126;
                  fStack_13c = fVar108 * fVar118 + fVar117 * fVar109 + fVar119 * fVar95;
                  fVar79 = *(float *)(lVar12 + 0xc + lVar74);
                  fVar81 = *(float *)(lVar12 + -0x24 + lVar74);
                  fVar97 = *(float *)(lVar12 + -0x14 + lVar74);
                  fVar123 = *(float *)(lVar12 + -4 + lVar74);
                  fVar131 = fVar81 * fVar97 + fVar79 * fVar123;
                  fVar104 = fVar81 * fVar97 - fVar79 * fVar123;
                  fVar98 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 + -fVar123 * fVar123
                  ;
                  fVar127 = fVar79 * fVar79 - fVar81 * fVar81;
                  fVar137 = fVar97 * fVar97 + fVar127 + -fVar123 * fVar123;
                  fVar136 = fVar81 * fVar123 - fVar79 * fVar97;
                  fVar101 = fVar79 * fVar97 + fVar81 * fVar123;
                  fVar139 = fVar97 * fVar123 + fVar79 * fVar81;
                  fVar94 = fVar97 * fVar123 - fVar79 * fVar81;
                  pfVar1 = (float *)(lVar12 + -0x30 + lVar74);
                  fVar79 = *pfVar1;
                  pfVar3 = (float *)(lVar12 + -0x20 + lVar74);
                  fVar81 = *pfVar3;
                  fVar80 = pfVar3[1];
                  fVar120 = fVar123 * fVar123 + fVar127 + -fVar97 * fVar97;
                  pfVar5 = (float *)(lVar12 + -0x10 + lVar74);
                  fVar97 = *pfVar5;
                  fVar123 = pfVar5[1];
                  fVar127 = pfVar5[2];
                  fVar131 = fVar131 + fVar131;
                  fVar136 = fVar136 + fVar136;
                  pfVar5 = (float *)(lVar12 + lVar74);
                  fVar108 = *pfVar5;
                  fVar117 = pfVar5[1];
                  fVar119 = pfVar5[2];
                  fVar99 = fVar98 * 1.0 + fVar131 * 0.0 + fVar136 * 0.0;
                  fVar100 = fVar98 * 0.0 + fVar131 * 1.0 + fVar136 * 0.0;
                  fVar136 = fVar98 * 0.0 + fVar131 * 0.0 + fVar136 * 1.0;
                  fVar104 = fVar104 + fVar104;
                  fVar139 = fVar139 + fVar139;
                  fVar101 = fVar101 + fVar101;
                  fVar94 = fVar94 + fVar94;
                  fVar98 = fVar104 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
                  fVar131 = fVar104 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
                  fVar104 = fVar104 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
                  fVar137 = fVar101 * 1.0 + fVar94 * 0.0 + fVar120 * 0.0;
                  fVar139 = fVar101 * 0.0 + fVar94 * 1.0 + fVar120 * 0.0;
                  fVar94 = fVar101 * 0.0 + fVar94 * 0.0 + fVar120 * 1.0;
                  fVar112 = fVar79 * fVar99 + fVar98 * 0.0 + fVar137 * 0.0;
                  fVar114 = fVar79 * fVar100 + fVar131 * 0.0 + fVar139 * 0.0;
                  fVar116 = fVar79 * fVar136 + fVar104 * 0.0 + fVar94 * 0.0;
                  fVar101 = fVar81 * fVar99 + fVar80 * fVar98 + fVar137 * 0.0;
                  fVar120 = fVar81 * fVar100 + fVar80 * fVar131 + fVar139 * 0.0;
                  fVar102 = fVar81 * fVar136 + fVar80 * fVar104 + fVar94 * 0.0;
                  fVar121 = fVar97 * fVar99 + fVar123 * fVar98 + fVar127 * fVar137;
                  fVar122 = fVar97 * fVar100 + fVar123 * fVar131 + fVar127 * fVar139;
                  fVar123 = fVar97 * fVar136 + fVar123 * fVar104 + fVar127 * fVar94;
                  fVar127 = fVar108 * fVar99 + fVar117 * fVar98 + fVar119 * fVar137 +
                            pfVar1[1] + 0.0;
                  fVar98 = fVar108 * fVar100 + fVar117 * fVar131 + fVar119 * fVar139 +
                           pfVar1[2] + 0.0;
                  fVar108 = fVar108 * fVar136 + fVar117 * fVar104 + fVar119 * fVar94 +
                            pfVar3[2] + 0.0;
                  fVar80 = fVar112 * fVar130 + fVar114 * fVar129 + fVar116 * local_148;
                  local_198 = fVar112 * fVar132 + fVar114 * fVar135 + fVar116 * fStack_144;
                  fVar81 = fVar112 * fVar133 + fVar114 * fVar138 + fVar116 * fStack_140;
                  fVar79 = fVar121 * fVar130 + fVar122 * fVar129 + fVar123 * local_148;
                  fVar97 = fVar121 * fVar132 + fVar122 * fVar135 + fVar123 * fStack_144;
                  fVar94 = fVar121 * fVar133 + fVar122 * fVar138 + fVar123 * fStack_140;
                  uVar71 = extraout_RDX_21;
                  fVar104 = fVar121 * fVar134 + fVar122 * fVar96 + fVar123 * fStack_13c;
                  fVar123 = fVar112 * fVar134 + fVar114 * fVar96 + fVar116 * fStack_13c;
                  fVar110 = fVar127 * fVar130 + fVar98 * fVar129 + fVar108 * local_148 +
                            fVar103 * fVar111 + fVar125 * fVar105 + fVar128 * fVar110 +
                            local_188 + 0.0;
                  fVar124 = fVar127 * fVar132 + fVar98 * fVar135 + fVar108 * fStack_144 +
                            fVar103 * fVar113 + fVar125 * fVar106 + fVar128 * fVar124 +
                            fStack_184 + 0.0;
                  fVar126 = fVar127 * fVar133 + fVar98 * fVar138 + fVar108 * fStack_140 +
                            fVar103 * fVar115 + fVar125 * fVar107 + fVar128 * fVar126 +
                            pfVar2[2] + 0.0;
                  fVar103 = fVar127 * fVar134 + fVar98 * fVar96 + fVar108 * fStack_13c +
                            fVar103 * fVar118 + fVar125 * fVar109 + fVar128 * fVar95 + 0.0;
                  fVar127 = fVar101 * fVar130 + fVar120 * fVar129 + fVar102 * local_148;
                  fVar108 = fVar101 * fVar132 + fVar120 * fVar135 + fVar102 * fStack_144;
                  fVar117 = fVar101 * fVar133 + fVar120 * fVar138 + fVar102 * fStack_140;
                  fVar119 = fVar101 * fVar134 + fVar120 * fVar96 + fVar102 * fStack_13c;
                }
                else {
                  bVar56 = bVar9 ^ 1U | bVar56;
                  if (bVar56 == 0) {
                    local_e8 = ZEXT416(*(uint *)((long)&(pAVar13->l).vx.field_0 + lVar74 + 0xc));
                    local_c8 = ZEXT416(*(uint *)((long)pAVar13 + lVar74 + -0x24));
                    local_b8 = ZEXT416(*(uint *)((long)pAVar13 + lVar74 + -0x14));
                    local_f8 = ZEXT416(*(uint *)((long)pAVar13 + lVar74 + -4));
                    pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x20);
                    local_118 = *pfVar1;
                    fStack_114 = pfVar1[1];
                    fStack_d0 = pfVar1[2];
                    fStack_10c = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x10);
                    local_108 = *pfVar1;
                    fStack_104 = pfVar1[1];
                    fStack_100 = pfVar1[2];
                    fStack_fc = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x30);
                    local_98 = *pfVar1;
                    fStack_8c = pfVar1[1];
                    pfVar1 = (float *)(lVar12 + -0x30 + lVar74);
                    fVar79 = *pfVar1;
                    fVar97 = pfVar1[1];
                    fVar123 = pfVar1[2];
                    pfVar1 = (float *)(lVar12 + -0x20 + lVar74);
                    fVar127 = *pfVar1;
                    fVar108 = pfVar1[1];
                    fVar117 = pfVar1[2];
                    puVar73 = (undefined8 *)(lVar12 + -0x10 + lVar74);
                    local_128 = *puVar73;
                    uStack_120 = puVar73[1];
                    pfVar1 = (float *)(lVar12 + lVar74);
                    fVar119 = *pfVar1;
                    fVar94 = pfVar1[1];
                    fVar104 = pfVar1[2];
                    fVar80 = fVar79 * local_98 + fVar97 * local_118 + fVar123 * local_108;
                    fVar110 = fVar79 * 0.0 + fVar97 * fStack_114 + fVar123 * fStack_104;
                    fVar79 = fVar79 * 0.0 + fVar97 * 0.0 + fVar123 * fStack_100;
                    local_148 = fVar127 * local_98 + fVar108 * local_118 + fVar117 * local_108;
                    fStack_144 = fVar127 * 0.0 + fVar108 * fStack_114 + fVar117 * fStack_104;
                    fStack_140 = fVar127 * 0.0 + fVar108 * 0.0 + fVar117 * fStack_100;
                    fStack_13c = fVar127 * fStack_8c + fVar108 * fStack_10c + fVar117 * fStack_fc;
                    fStack_110 = 0.0;
                    fStack_94 = 0.0;
                    fStack_90 = 0.0;
                    pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                    local_a8._0_4_ =
                         fVar119 * local_98 + fVar94 * local_118 + fVar104 * local_108 + *pfVar1;
                    local_a8._4_4_ =
                         fVar119 * 0.0 + fVar94 * fStack_114 + fVar104 * fStack_104 + pfVar1[1];
                    fStack_a0 = fVar119 * 0.0 + fVar94 * 0.0 + fVar104 * fStack_100 + pfVar1[2];
                    register0x0000128c =
                         fVar119 * fStack_8c + fVar94 * fStack_10c + fVar104 * fStack_fc + pfVar1[3]
                    ;
                    local_d8 = local_118;
                    fStack_d4 = fStack_114;
                    fStack_cc = fStack_10c;
                    if (((fVar110 != 0.0) || (NAN(fVar110))) ||
                       ((fVar79 != 0.0 ||
                        (((NAN(fVar79) || (fStack_140 != 0.0)) || (NAN(fStack_140))))))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                 ,0x61);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                      std::ostream::put(-0x30);
                      std::ostream::flush();
                      uVar71 = extraout_RDX_23;
                    }
                    fVar79 = local_98 * (float)local_128 +
                             local_118 * local_128._4_4_ + local_108 * (float)uStack_120;
                    fVar97 = fStack_94 * (float)local_128 +
                             fStack_114 * local_128._4_4_ + fStack_104 * (float)uStack_120;
                    fVar94 = fStack_90 * (float)local_128 +
                             fStack_110 * local_128._4_4_ + fStack_100 * (float)uStack_120;
                    local_150 = true;
                    fVar104 = (float)local_f8._0_4_;
                    fVar123 = (float)local_c8._0_4_;
                    fVar110 = (float)local_a8._0_4_;
                    fVar124 = (float)local_a8._4_4_;
                    fVar126 = fStack_a0;
                    fVar103 = (float)local_e8._0_4_;
                    fVar127 = local_148;
                    fVar108 = fStack_144;
                    fVar117 = fStack_d0;
                    fVar119 = (float)local_b8._0_4_;
                  }
                  else {
                    if (((local_198 != 0.0) || (NAN(local_198))) ||
                       ((fVar81 != 0.0 ||
                        ((NAN(fVar81) ||
                         (uVar6 = *(undefined8 *)((long)pAVar13 + lVar74 + -0x10),
                         auVar26._4_4_ = -(uint)(*(float *)((long)pAVar13 + lVar74 + -0x20) != 0.0),
                         auVar26._0_4_ = -(uint)(*(float *)((long)pAVar13 + lVar74 + -0x18) != 0.0),
                         auVar26._8_4_ = -(uint)((float)uVar6 != 0.0),
                         auVar26._12_4_ = -(uint)((float)((ulong)uVar6 >> 0x20) != 0.0),
                         uVar57 = movmskps((int)CONCAT71(uVar69,bVar56),auVar26),
                         (char)uVar57 != '\0')))))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                 ,0x83);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                      std::ostream::put(-0x30);
                      std::ostream::flush();
                      uVar71 = extraout_RDX_22;
                    }
                    pfVar1 = (float *)(lVar12 + -0x30 + lVar74);
                    pfVar2 = (float *)(lVar12 + -0x20 + lVar74);
                    pfVar3 = (float *)(lVar12 + -0x10 + lVar74);
                    fVar79 = *pfVar3;
                    fVar97 = pfVar3[1];
                    pfVar5 = (float *)(lVar12 + lVar74);
                    uVar6 = *(undefined8 *)((long)&(pAVar13->l).vx.field_0 + lVar74);
                    fVar80 = *(float *)((long)pAVar13 + lVar74 + -0x30) * *pfVar1;
                    local_198 = pfVar1[1] + (float)uVar6;
                    fVar81 = pfVar1[2] + (float)((ulong)uVar6 >> 0x20);
                    fVar94 = pfVar3[2] * *(float *)((long)pAVar13 + lVar74 + -8);
                    local_150 = true;
                    fVar104 = pfVar3[3];
                    fVar123 = pfVar1[3];
                    fVar110 = *pfVar5;
                    fVar124 = pfVar5[1];
                    fVar126 = pfVar5[2];
                    fVar103 = pfVar5[3];
                    fVar127 = *pfVar2;
                    fVar108 = pfVar2[1] * *(float *)((long)pAVar13 + lVar74 + -0x1c);
                    fVar117 = pfVar2[2] + *(float *)((long)&(pAVar13->l).vx.field_0 + lVar74 + 8);
                    fVar119 = pfVar2[3];
                  }
                }
              }
            }
            else {
              pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x24);
              auVar23._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar23._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar23._8_4_ = -(uint)(pfVar1[2] != 1.0);
              auVar23._12_4_ = -(uint)(pfVar1[3] != 0.0);
              uVar75 = movmskps(uVar75,auVar23);
              if ((((bVar9 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                 (((uVar75 & 4) != 0 ||
                  (bVar70 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70),
                  bVar70 != 0)))) goto LAB_00162abf;
              pfVar1 = (float *)((long)pAVar13 + lVar74 + -0x14);
              auVar24._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar24._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar24._8_4_ = -(uint)(pfVar1[2] != 0.0);
              auVar24._12_4_ = -(uint)(pfVar1[3] != 1.0);
              uVar75 = movmskps(uVar75,auVar24);
              if (((((bVar9 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0)) ||
                 (bVar70 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70),
                 bVar70 != 0)) goto LAB_00162abf;
              pfVar1 = (float *)((long)pAVar13 + lVar74 + -4);
              auVar25._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar25._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar25._8_4_ = -(uint)(pfVar1[2] != 0.0);
              auVar25._12_4_ = -(uint)(pfVar1[3] != 0.0);
              uVar75 = movmskps(uVar75,auVar25);
              if ((((bVar9 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0))
              goto LAB_00162abf;
              bVar70 = ((byte)uVar75 & 8) >> 3;
              uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar70);
              uVar71 = (ulong)uVar75;
              if ((bVar70 != 0) ||
                 ((bVar9 != false &&
                  ((fVar79 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar74 + 0xc),
                   fVar79 != 1.0 || (NAN(fVar79))))))) goto LAB_00162abf;
              pfVar1 = (float *)(lVar12 + -0x30 + lVar74);
              fVar80 = *pfVar1;
              local_198 = pfVar1[1];
              fVar81 = pfVar1[2];
              fVar123 = pfVar1[3];
              pfVar1 = (float *)(lVar12 + -0x20 + lVar74);
              fVar127 = *pfVar1;
              fVar108 = pfVar1[1];
              fVar117 = pfVar1[2];
              fVar119 = pfVar1[3];
              pfVar1 = (float *)(lVar12 + -0x10 + lVar74);
              fVar79 = *pfVar1;
              fVar97 = pfVar1[1];
              fVar94 = pfVar1[2];
              fVar104 = pfVar1[3];
              pfVar1 = (float *)(lVar12 + lVar74);
              fVar110 = *pfVar1;
              fVar124 = pfVar1[1];
              fVar126 = pfVar1[2];
              fVar103 = pfVar1[3];
              local_150 = (bool)bVar56;
            }
LAB_0016321e:
            pfVar1 = (float *)((long)local_158 + lVar74 + -0x30);
            *pfVar1 = fVar80;
            pfVar1[1] = local_198;
            pfVar1[2] = fVar81;
            pfVar1[3] = fVar123;
            pfVar1 = (float *)((long)local_158 + lVar74 + -0x20);
            *pfVar1 = fVar127;
            pfVar1[1] = fVar108;
            pfVar1[2] = fVar117;
            pfVar1[3] = fVar119;
            pfVar1 = (float *)((long)local_158 + lVar74 + -0x10);
            *pfVar1 = fVar79;
            pfVar1[1] = fVar97;
            pfVar1[2] = fVar94;
            pfVar1[3] = fVar104;
            pfVar1 = (float *)((long)&(local_158->l).vx.field_0 + lVar74);
            *pfVar1 = fVar110;
            pfVar1[1] = fVar124;
            pfVar1[2] = fVar126;
            pfVar1[3] = fVar103;
            uVar72 = uVar72 + 1;
            lVar74 = lVar74 + 0x40;
            pAVar60 = local_158;
          } while (uVar72 < (spaces->spaces).size_active);
        }
        goto LAB_00163677;
      }
    }
    local_158 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
    sStack_160 = 0;
    local_178._16_8_ = 0;
    local_150 = true;
    if (spaces->quaternion == false) {
      local_150 = SUB41((int)plVar58[0x12],0);
    }
  }
LAB_00163677:
  convertGeometries(local_80,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                              *)local_130,(Ref<embree::SceneGraph::Node> *)(plVar58 + 0x13),
                    (Transformations *)local_178);
  alignedFree(local_158);
  (**(code **)(*plVar58 + 0x18))(plVar58);
  return;
}

Assistant:

void convertGeometries(std::vector<Ref<SceneGraph::Node>>& group, const Ref<SceneGraph::Node>& node, const SceneGraph::Transformations& spaces)
    {
      if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
        convertGeometries(group,xfmNode->child, spaces*xfmNode->spaces);
      }
      else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
        for (size_t i = 0; i < xfmNode->spaces.size(); ++i)
          convertGeometries(group,xfmNode->child, spaces*xfmNode->spaces[i]);
      }
      else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) {
        for (const auto& child : groupNode->children) convertGeometries(group,child,spaces);
      }
      else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>()) {
        group.push_back(new SceneGraph::TriangleMeshNode(mesh,spaces));
      }
      else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) {
        group.push_back(new SceneGraph::QuadMeshNode(mesh,spaces));
      }
      else if (Ref<SceneGraph::GridMeshNode> mesh = node.dynamicCast<SceneGraph::GridMeshNode>()) {
        group.push_back(new SceneGraph::GridMeshNode(mesh,spaces));
      }
      else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>()) {
        group.push_back(new SceneGraph::SubdivMeshNode(mesh,spaces));
      }
      else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>()) {
        group.push_back(new SceneGraph::HairSetNode(mesh,spaces));
      }
      else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>()) {
        group.push_back(new SceneGraph::PointSetNode(mesh,spaces));
      }
    }